

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::LayerNorm_x86_avx512::forward_inplace
          (LayerNorm_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  uint *puVar2;
  undefined4 uVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  byte bVar30;
  byte bVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  int iVar36;
  undefined1 (*pauVar37) [64];
  int iVar38;
  uint uVar39;
  int iVar40;
  uint uVar41;
  undefined1 (*pauVar42) [64];
  uint uVar43;
  undefined1 (*pauVar44) [64];
  uint uVar45;
  ulong uVar46;
  long lVar47;
  uint uVar48;
  undefined1 (*pauVar49) [64];
  undefined1 (*pauVar50) [64];
  ulong uVar51;
  uint uVar52;
  ushort uVar53;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar54 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar55 [16];
  undefined1 auVar72 [64];
  undefined1 auVar56 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar120 [48];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar59 [16];
  undefined1 auVar81 [64];
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  undefined1 auVar62 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar101 [64];
  undefined1 auVar103 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar113 [64];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  float _mean;
  float fVar121;
  undefined1 auVar122 [64];
  float fVar123;
  float fVar127;
  __m128 _b_128;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float _a;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float _b;
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar165;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar179 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar180 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  ulong local_48;
  undefined1 auVar78 [64];
  undefined1 auVar82 [64];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar94 [64];
  undefined1 auVar100 [64];
  undefined1 auVar102 [64];
  undefined1 auVar104 [64];
  undefined1 auVar112 [64];
  undefined1 auVar114 [64];
  undefined1 auVar116 [64];
  
  auVar122 = _DAT_00521e80;
  iVar36 = bottom_top_blob->elempack;
  iVar38 = bottom_top_blob->dims;
  iVar40 = bottom_top_blob->w;
  pp_Var4 = this->_vptr_LayerNorm_x86_avx512;
  p_Var5 = pp_Var4[-3];
  pauVar50 = *(undefined1 (**) [64])(&this->field_0xe0 + (long)p_Var5);
  pauVar44 = *(undefined1 (**) [64])(&this->field_0x128 + (long)p_Var5);
  if (iVar38 == 1) {
    uVar43 = iVar40 * iVar36;
    pauVar49 = (undefined1 (*) [64])bottom_top_blob->data;
    pauVar37 = pauVar49;
    if ((int)uVar43 < 0x10) {
      uVar48 = 0;
      auVar122 = ZEXT864(0);
    }
    else {
      uVar48 = uVar43 & 0x7ffffff0;
      auVar122 = ZEXT864(0);
      iVar36 = 0x10;
      do {
        auVar122 = vaddps_avx512f(auVar122,*pauVar37);
        pauVar37 = pauVar37 + 1;
        iVar36 = iVar36 + 0x10;
      } while (iVar36 <= (int)uVar43);
    }
    fVar121 = 0.0;
    fVar165 = 0.0;
    fVar123 = 0.0;
    fVar127 = 0.0;
    fVar128 = 0.0;
    fVar129 = 0.0;
    fVar130 = 0.0;
    fVar131 = 0.0;
    uVar52 = uVar48 | 8;
    while ((int)uVar52 <= (int)uVar43) {
      fVar123 = fVar123 + *(float *)*pauVar37;
      fVar127 = fVar127 + *(float *)(*pauVar37 + 4);
      fVar121 = fVar121 + *(float *)(*pauVar37 + 8);
      fVar165 = fVar165 + *(float *)(*pauVar37 + 0xc);
      fVar128 = fVar128 + *(float *)(*pauVar37 + 0x10);
      fVar129 = fVar129 + *(float *)(*pauVar37 + 0x14);
      fVar130 = fVar130 + *(float *)(*pauVar37 + 0x18);
      fVar131 = fVar131 + *(float *)(*pauVar37 + 0x1c);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
      uVar52 = uVar48 + 0x10;
      uVar48 = uVar48 + 8;
    }
    iVar36 = uVar48 + 4;
    auVar54 = ZEXT816(0) << 0x40;
    while (iVar36 <= (int)uVar43) {
      auVar56._0_4_ = auVar54._0_4_ + *(float *)*pauVar37;
      auVar56._4_4_ = auVar54._4_4_ + *(float *)(*pauVar37 + 4);
      auVar56._8_4_ = auVar54._8_4_ + *(float *)(*pauVar37 + 8);
      auVar56._12_4_ = auVar54._12_4_ + *(float *)(*pauVar37 + 0xc);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
      iVar36 = uVar48 + 8;
      auVar54 = auVar56;
      uVar48 = uVar48 + 4;
    }
    fVar134 = 0.0;
    if ((int)uVar48 < (int)uVar43) {
      auVar67 = vpbroadcastq_avx512f();
      uVar51 = 0;
      auVar68 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar69 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar66 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        auVar71 = auVar66;
        auVar66 = vpbroadcastq_avx512f();
        auVar70 = vporq_avx512f(auVar66,auVar68);
        auVar66 = vporq_avx512f(auVar66,auVar69);
        uVar19 = vpcmpuq_avx512f(auVar66,auVar67,2);
        bVar30 = (byte)uVar19;
        uVar19 = vpcmpuq_avx512f(auVar70,auVar67,2);
        bVar31 = (byte)uVar19;
        uVar53 = CONCAT11(bVar31,bVar30);
        piVar1 = (int *)(*pauVar37 + uVar51 * 4);
        auVar66._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
        auVar66._0_4_ = (uint)(bVar30 & 1) * *piVar1;
        auVar66._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
        auVar66._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
        auVar66._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
        auVar66._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
        auVar66._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
        auVar66._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
        auVar66._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
        auVar66._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
        auVar66._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
        auVar66._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
        auVar66._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
        auVar66._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
        auVar66._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
        auVar66._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
        auVar66 = vaddps_avx512f(auVar66,auVar71);
        uVar51 = uVar51 + 0x10;
      } while (((ulong)(~uVar48 + uVar43) + 0x10 & 0x1fffffff0) != uVar51);
      auVar67._0_4_ = (uint)(bVar30 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar71._0_4_
      ;
      bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
      auVar67._4_4_ = (uint)bVar6 * auVar66._4_4_ | (uint)!bVar6 * auVar71._4_4_;
      bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
      auVar67._8_4_ = (uint)bVar6 * auVar66._8_4_ | (uint)!bVar6 * auVar71._8_4_;
      bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
      auVar67._12_4_ = (uint)bVar6 * auVar66._12_4_ | (uint)!bVar6 * auVar71._12_4_;
      bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
      auVar67._16_4_ = (uint)bVar6 * auVar66._16_4_ | (uint)!bVar6 * auVar71._16_4_;
      bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
      auVar67._20_4_ = (uint)bVar6 * auVar66._20_4_ | (uint)!bVar6 * auVar71._20_4_;
      bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
      auVar67._24_4_ = (uint)bVar6 * auVar66._24_4_ | (uint)!bVar6 * auVar71._24_4_;
      bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
      auVar67._28_4_ = (uint)bVar6 * auVar66._28_4_ | (uint)!bVar6 * auVar71._28_4_;
      auVar67._32_4_ =
           (uint)(bVar31 & 1) * auVar66._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar71._32_4_;
      bVar6 = (bool)(bVar31 >> 1 & 1);
      auVar67._36_4_ = (uint)bVar6 * auVar66._36_4_ | (uint)!bVar6 * auVar71._36_4_;
      bVar6 = (bool)(bVar31 >> 2 & 1);
      auVar67._40_4_ = (uint)bVar6 * auVar66._40_4_ | (uint)!bVar6 * auVar71._40_4_;
      bVar6 = (bool)(bVar31 >> 3 & 1);
      auVar67._44_4_ = (uint)bVar6 * auVar66._44_4_ | (uint)!bVar6 * auVar71._44_4_;
      bVar6 = (bool)(bVar31 >> 4 & 1);
      auVar67._48_4_ = (uint)bVar6 * auVar66._48_4_ | (uint)!bVar6 * auVar71._48_4_;
      bVar6 = (bool)(bVar31 >> 5 & 1);
      auVar67._52_4_ = (uint)bVar6 * auVar66._52_4_ | (uint)!bVar6 * auVar71._52_4_;
      bVar6 = (bool)(bVar31 >> 6 & 1);
      auVar67._56_4_ = (uint)bVar6 * auVar66._56_4_ | (uint)!bVar6 * auVar71._56_4_;
      auVar67._60_4_ =
           (uint)(bVar31 >> 7) * auVar66._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar71._60_4_;
      auVar61 = vextractf64x4_avx512f(auVar67,1);
      auVar66 = vaddps_avx512f(auVar67,ZEXT3264(auVar61));
      auVar57._0_4_ = auVar66._0_4_ + auVar66._16_4_;
      auVar57._4_4_ = auVar66._4_4_ + auVar66._20_4_;
      auVar57._8_4_ = auVar66._8_4_ + auVar66._24_4_;
      auVar57._12_4_ = auVar66._12_4_ + auVar66._28_4_;
      auVar56 = vshufpd_avx(auVar57,auVar57,1);
      auVar59._0_4_ = auVar57._0_4_ + auVar56._0_4_;
      auVar59._4_4_ = auVar57._4_4_ + auVar56._4_4_;
      auVar59._8_4_ = auVar57._8_4_ + auVar56._8_4_;
      auVar59._12_4_ = auVar57._12_4_ + auVar56._12_4_;
      auVar56 = vhaddps_avx(auVar59,auVar59);
      fVar134 = auVar56._0_4_;
    }
    auVar61 = vextractf64x4_avx512f(auVar122,1);
    auVar122 = vaddps_avx512f(auVar122,ZEXT3264(auVar61));
    auVar55._0_4_ = auVar122._0_4_ + auVar122._16_4_;
    auVar55._4_4_ = auVar122._4_4_ + auVar122._20_4_;
    auVar55._8_4_ = auVar122._8_4_ + auVar122._24_4_;
    auVar55._12_4_ = auVar122._12_4_ + auVar122._28_4_;
    auVar56 = vshufpd_avx(auVar55,auVar55,1);
    auVar58._0_4_ = auVar55._0_4_ + auVar56._0_4_;
    auVar58._4_4_ = auVar55._4_4_ + auVar56._4_4_;
    auVar58._8_4_ = auVar55._8_4_ + auVar56._8_4_;
    auVar58._12_4_ = auVar55._12_4_ + auVar56._12_4_;
    auVar56 = vhaddps_avx(auVar58,auVar58);
    auVar124._0_4_ = fVar128 + fVar123;
    auVar124._4_4_ = fVar129 + fVar127;
    auVar124._8_4_ = fVar130 + fVar121;
    auVar124._12_4_ = fVar131 + fVar165;
    auVar57 = vshufps_avx(auVar54,auVar124,0x41);
    auVar54 = vshufps_avx(auVar54,auVar124,0xeb);
    auVar125._0_4_ = auVar54._0_4_ + auVar57._0_4_;
    auVar125._4_4_ = auVar54._4_4_ + auVar57._4_4_;
    auVar125._8_4_ = auVar54._8_4_ + auVar57._8_4_;
    auVar125._12_4_ = auVar54._12_4_ + auVar57._12_4_;
    auVar54 = vshufpd_avx(auVar125,auVar125,1);
    auVar126._0_4_ = auVar125._0_4_ + auVar54._0_4_;
    auVar126._4_4_ = auVar125._4_4_ + auVar54._4_4_;
    auVar126._8_4_ = auVar125._8_4_ + auVar54._8_4_;
    auVar126._12_4_ = auVar125._12_4_ + auVar54._12_4_;
    auVar54 = vhaddps_avx(auVar126,auVar126);
    auVar54._0_4_ = (fVar134 + auVar56._0_4_ + auVar54._0_4_) / (float)(int)uVar43;
    auVar54._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar122 = vbroadcastss_avx512f(auVar54);
    pauVar37 = pauVar49;
    if ((int)uVar43 < 0x10) {
      uVar48 = 0;
      auVar66 = ZEXT864(0) << 0x20;
    }
    else {
      uVar48 = uVar43 & 0x7ffffff0;
      auVar66 = ZEXT864(0) << 0x40;
      iVar36 = 0x10;
      do {
        auVar67 = vsubps_avx512f(*pauVar37,auVar122);
        auVar66 = vfmadd231ps_avx512f(auVar66,auVar67,auVar67);
        pauVar37 = pauVar37 + 1;
        iVar36 = iVar36 + 0x10;
      } while (iVar36 <= (int)uVar43);
    }
    auVar56 = ZEXT816(0) << 0x40;
    uVar52 = uVar48 | 8;
    while ((int)uVar52 <= (int)uVar43) {
      auVar61 = vsubps_avx(*(undefined1 (*) [32])*pauVar37,auVar122._0_32_);
      auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar61,auVar61);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
      uVar52 = uVar48 + 0x10;
      uVar48 = uVar48 + 8;
    }
    auVar57 = ZEXT816(0) << 0x40;
    iVar36 = uVar48 + 4;
    while (iVar36 <= (int)uVar43) {
      auVar59 = vsubps_avx(*(undefined1 (*) [16])*pauVar37,auVar122._0_16_);
      auVar57 = vfmadd231ps_fma(auVar57,auVar59,auVar59);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
      iVar36 = uVar48 + 8;
      uVar48 = uVar48 + 4;
    }
    fVar121 = 0.0;
    if ((int)uVar48 < (int)uVar43) {
      auVar68 = vpbroadcastq_avx512f();
      uVar51 = 0;
      auVar69 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar70 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar67 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        auVar179 = auVar67;
        auVar67 = vpbroadcastq_avx512f();
        auVar71 = vporq_avx512f(auVar67,auVar69);
        auVar67 = vporq_avx512f(auVar67,auVar70);
        uVar19 = vpcmpuq_avx512f(auVar67,auVar68,2);
        bVar30 = (byte)uVar19;
        uVar19 = vpcmpuq_avx512f(auVar71,auVar68,2);
        bVar31 = (byte)uVar19;
        uVar53 = CONCAT11(bVar31,bVar30);
        piVar1 = (int *)(*pauVar37 + uVar51 * 4);
        auVar71._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
        auVar71._0_4_ = (uint)(bVar30 & 1) * *piVar1;
        auVar71._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
        auVar71._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
        auVar71._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
        auVar71._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
        auVar71._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
        auVar71._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
        auVar71._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
        auVar71._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
        auVar71._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
        auVar71._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
        auVar71._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
        auVar71._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
        auVar71._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
        auVar71._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
        auVar67 = vsubps_avx512f(auVar71,auVar122);
        auVar67 = vfmadd213ps_avx512f(auVar67,auVar67,auVar179);
        uVar51 = uVar51 + 0x10;
      } while (((ulong)(~uVar48 + uVar43) + 0x10 & 0x1fffffff0) != uVar51);
      auVar122._0_4_ =
           (uint)(bVar30 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar179._0_4_;
      bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar6 * auVar67._4_4_ | (uint)!bVar6 * auVar179._4_4_;
      bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar6 * auVar67._8_4_ | (uint)!bVar6 * auVar179._8_4_;
      bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar6 * auVar67._12_4_ | (uint)!bVar6 * auVar179._12_4_;
      bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar6 * auVar67._16_4_ | (uint)!bVar6 * auVar179._16_4_;
      bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar6 * auVar67._20_4_ | (uint)!bVar6 * auVar179._20_4_;
      bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar6 * auVar67._24_4_ | (uint)!bVar6 * auVar179._24_4_;
      bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
      auVar122._28_4_ = (uint)bVar6 * auVar67._28_4_ | (uint)!bVar6 * auVar179._28_4_;
      auVar122._32_4_ =
           (uint)(bVar31 & 1) * auVar67._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar179._32_4_;
      bVar6 = (bool)(bVar31 >> 1 & 1);
      auVar122._36_4_ = (uint)bVar6 * auVar67._36_4_ | (uint)!bVar6 * auVar179._36_4_;
      bVar6 = (bool)(bVar31 >> 2 & 1);
      auVar122._40_4_ = (uint)bVar6 * auVar67._40_4_ | (uint)!bVar6 * auVar179._40_4_;
      bVar6 = (bool)(bVar31 >> 3 & 1);
      auVar122._44_4_ = (uint)bVar6 * auVar67._44_4_ | (uint)!bVar6 * auVar179._44_4_;
      bVar6 = (bool)(bVar31 >> 4 & 1);
      auVar122._48_4_ = (uint)bVar6 * auVar67._48_4_ | (uint)!bVar6 * auVar179._48_4_;
      bVar6 = (bool)(bVar31 >> 5 & 1);
      auVar122._52_4_ = (uint)bVar6 * auVar67._52_4_ | (uint)!bVar6 * auVar179._52_4_;
      bVar6 = (bool)(bVar31 >> 6 & 1);
      auVar122._56_4_ = (uint)bVar6 * auVar67._56_4_ | (uint)!bVar6 * auVar179._56_4_;
      auVar122._60_4_ =
           (uint)(bVar31 >> 7) * auVar67._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar179._60_4_;
      auVar61 = vextractf64x4_avx512f(auVar122,1);
      auVar122 = vaddps_avx512f(auVar122,ZEXT3264(auVar61));
      auVar135._0_4_ = auVar122._0_4_ + auVar122._16_4_;
      auVar135._4_4_ = auVar122._4_4_ + auVar122._20_4_;
      auVar135._8_4_ = auVar122._8_4_ + auVar122._24_4_;
      auVar135._12_4_ = auVar122._12_4_ + auVar122._28_4_;
      auVar59 = vshufpd_avx(auVar135,auVar135,1);
      auVar136._0_4_ = auVar135._0_4_ + auVar59._0_4_;
      auVar136._4_4_ = auVar135._4_4_ + auVar59._4_4_;
      auVar136._8_4_ = auVar135._8_4_ + auVar59._8_4_;
      auVar136._12_4_ = auVar135._12_4_ + auVar59._12_4_;
      auVar59 = vhaddps_avx(auVar136,auVar136);
      fVar121 = auVar59._0_4_;
    }
    auVar61 = vextractf64x4_avx512f(auVar66,1);
    auVar122 = vaddps_avx512f(auVar66,ZEXT3264(auVar61));
    auVar132._0_4_ = auVar122._0_4_ + auVar122._16_4_;
    auVar132._4_4_ = auVar122._4_4_ + auVar122._20_4_;
    auVar132._8_4_ = auVar122._8_4_ + auVar122._24_4_;
    auVar132._12_4_ = auVar122._12_4_ + auVar122._28_4_;
    auVar59 = vshufpd_avx(auVar132,auVar132,1);
    auVar133._0_4_ = auVar132._0_4_ + auVar59._0_4_;
    auVar133._4_4_ = auVar132._4_4_ + auVar59._4_4_;
    auVar133._8_4_ = auVar132._8_4_ + auVar59._8_4_;
    auVar133._12_4_ = auVar132._12_4_ + auVar59._12_4_;
    auVar59 = vhaddps_avx(auVar133,auVar133);
    auVar137._0_4_ = auVar56._0_4_ + 0.0;
    auVar137._4_4_ = auVar56._4_4_ + 0.0;
    auVar137._8_4_ = auVar56._8_4_ + 0.0;
    auVar137._12_4_ = auVar56._12_4_ + 0.0;
    auVar56 = vshufps_avx(auVar57,auVar137,0x41);
    auVar57 = vshufps_avx(auVar57,auVar137,0xeb);
    auVar138._0_4_ = auVar57._0_4_ + auVar56._0_4_;
    auVar138._4_4_ = auVar57._4_4_ + auVar56._4_4_;
    auVar138._8_4_ = auVar57._8_4_ + auVar56._8_4_;
    auVar138._12_4_ = auVar57._12_4_ + auVar56._12_4_;
    auVar56 = vshufpd_avx(auVar138,auVar138,1);
    auVar139._0_4_ = auVar138._0_4_ + auVar56._0_4_;
    auVar139._4_4_ = auVar138._4_4_ + auVar56._4_4_;
    auVar139._8_4_ = auVar138._8_4_ + auVar56._8_4_;
    auVar139._12_4_ = auVar138._12_4_ + auVar56._12_4_;
    auVar56 = vhaddps_avx(auVar139,auVar139);
    fVar121 = (fVar121 + auVar59._0_4_ + auVar56._0_4_) / (float)(int)uVar43 +
              *(float *)(&this->field_0xd4 + (long)p_Var5);
    auVar56 = vrsqrtss_avx(ZEXT416((uint)fVar121),ZEXT416((uint)fVar121));
    auVar57 = vfmadd213ss_fma(ZEXT416((uint)(fVar121 * auVar56._0_4_)),auVar56,ZEXT416(0xc0400000));
    fVar121 = auVar56._0_4_ * -0.5 * auVar57._0_4_;
    auVar23._8_4_ = 0x80000000;
    auVar23._0_8_ = 0x8000000080000000;
    auVar23._12_4_ = 0x80000000;
    auVar54 = vxorps_avx512vl(auVar54,auVar23);
    auVar122 = vbroadcastss_avx512f(ZEXT416((uint)fVar121));
    auVar54 = ZEXT416((uint)(fVar121 * auVar54._0_4_));
    auVar66 = vbroadcastss_avx512f(auVar54);
    if (*(int *)(&this->field_0xd8 + (long)p_Var5) == 0) {
      uVar48 = 0;
      if (0xf < (int)uVar43) {
        uVar48 = uVar43 & 0x7ffffff0;
        iVar36 = 0x10;
        do {
          auVar67 = vfmadd132ps_avx512f(*pauVar49,auVar66,auVar122);
          *pauVar49 = auVar67;
          pauVar49 = pauVar49 + 1;
          iVar36 = iVar36 + 0x10;
        } while (iVar36 <= (int)uVar43);
      }
      uVar52 = uVar48 | 8;
      while ((int)uVar52 <= (int)uVar43) {
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar49,auVar66._0_32_,auVar122._0_32_);
        *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar54);
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
        uVar52 = uVar48 + 0x10;
        uVar48 = uVar48 + 8;
      }
      iVar36 = uVar48 + 4;
      while (iVar36 <= (int)uVar43) {
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar49,auVar66._0_16_,auVar122._0_16_);
        *(undefined1 (*) [16])*pauVar49 = auVar54;
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
        iVar36 = uVar48 + 8;
        uVar48 = uVar48 + 4;
      }
      if ((int)uVar48 < (int)uVar43) {
        auVar67 = vpbroadcastq_avx512f();
        uVar51 = 0;
        auVar68 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar69 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar70 = vpbroadcastq_avx512f();
          auVar71 = vporq_avx512f(auVar70,auVar68);
          auVar70 = vporq_avx512f(auVar70,auVar69);
          uVar19 = vpcmpuq_avx512f(auVar70,auVar67,2);
          bVar30 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar71,auVar67,2);
          bVar31 = (byte)uVar19;
          uVar53 = CONCAT11(bVar31,bVar30);
          piVar1 = (int *)(*pauVar49 + uVar51 * 4);
          auVar70._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
          auVar70._0_4_ = (uint)(bVar30 & 1) * *piVar1;
          auVar70._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
          auVar70._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
          auVar70._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
          auVar70._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
          auVar70._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
          auVar70._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
          auVar70._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
          auVar70._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
          auVar70._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
          auVar70._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
          auVar70._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
          auVar70._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
          auVar70._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
          auVar70._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
          auVar70 = vfmadd213ps_avx512f(auVar70,auVar122,auVar66);
          puVar2 = (uint *)(*pauVar49 + uVar51 * 4);
          bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar53 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar53 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar53 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar53 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar53 >> 7) & 1);
          bVar13 = (bool)(bVar31 >> 1 & 1);
          bVar14 = (bool)(bVar31 >> 2 & 1);
          bVar15 = (bool)(bVar31 >> 3 & 1);
          bVar16 = (bool)(bVar31 >> 4 & 1);
          bVar17 = (bool)(bVar31 >> 5 & 1);
          bVar18 = (bool)(bVar31 >> 6 & 1);
          *puVar2 = (uint)(bVar30 & 1) * auVar70._0_4_ | (uint)!(bool)(bVar30 & 1) * *puVar2;
          puVar2[1] = (uint)bVar6 * auVar70._4_4_ | (uint)!bVar6 * puVar2[1];
          puVar2[2] = (uint)bVar8 * auVar70._8_4_ | (uint)!bVar8 * puVar2[2];
          puVar2[3] = (uint)bVar9 * auVar70._12_4_ | (uint)!bVar9 * puVar2[3];
          puVar2[4] = (uint)bVar10 * auVar70._16_4_ | (uint)!bVar10 * puVar2[4];
          puVar2[5] = (uint)bVar7 * auVar70._20_4_ | (uint)!bVar7 * puVar2[5];
          puVar2[6] = (uint)bVar11 * auVar70._24_4_ | (uint)!bVar11 * puVar2[6];
          puVar2[7] = (uint)bVar12 * auVar70._28_4_ | (uint)!bVar12 * puVar2[7];
          puVar2[8] = (uint)(bVar31 & 1) * auVar70._32_4_ | (uint)!(bool)(bVar31 & 1) * puVar2[8];
          puVar2[9] = (uint)bVar13 * auVar70._36_4_ | (uint)!bVar13 * puVar2[9];
          puVar2[10] = (uint)bVar14 * auVar70._40_4_ | (uint)!bVar14 * puVar2[10];
          puVar2[0xb] = (uint)bVar15 * auVar70._44_4_ | (uint)!bVar15 * puVar2[0xb];
          puVar2[0xc] = (uint)bVar16 * auVar70._48_4_ | (uint)!bVar16 * puVar2[0xc];
          puVar2[0xd] = (uint)bVar17 * auVar70._52_4_ | (uint)!bVar17 * puVar2[0xd];
          puVar2[0xe] = (uint)bVar18 * auVar70._56_4_ | (uint)!bVar18 * puVar2[0xe];
          puVar2[0xf] = (uint)(bVar31 >> 7) * auVar70._60_4_ |
                        (uint)!(bool)(bVar31 >> 7) * puVar2[0xf];
          uVar51 = uVar51 + 0x10;
        } while (((ulong)(uVar43 + ~uVar48) + 0x10 & 0x1fffffff0) != uVar51);
      }
    }
    else {
      uVar48 = 0;
      if (0xf < (int)uVar43) {
        uVar48 = uVar43 & 0x7ffffff0;
        iVar36 = 0x10;
        do {
          auVar67 = vfmadd132ps_avx512f(*pauVar49,auVar66,auVar122);
          auVar67 = vfmadd213ps_avx512f(auVar67,*pauVar50,*pauVar44);
          *pauVar49 = auVar67;
          pauVar49 = pauVar49 + 1;
          pauVar50 = pauVar50 + 1;
          pauVar44 = pauVar44 + 1;
          iVar36 = iVar36 + 0x10;
        } while (iVar36 <= (int)uVar43);
      }
      uVar52 = uVar48 | 8;
      while ((int)uVar52 <= (int)uVar43) {
        auVar56 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar49,auVar66._0_32_,auVar122._0_32_);
        auVar56 = vfmadd213ps_fma(ZEXT1632(auVar56),*(undefined1 (*) [32])*pauVar50,
                                  *(undefined1 (*) [32])*pauVar44);
        *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar56);
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
        pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
        pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
        uVar52 = uVar48 + 0x10;
        uVar48 = uVar48 + 8;
      }
      iVar36 = uVar48 + 4;
      while (iVar36 <= (int)uVar43) {
        auVar56 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar49,auVar66._0_16_,auVar122._0_16_);
        auVar56 = vfmadd213ps_fma(auVar56,*(undefined1 (*) [16])*pauVar50,
                                  *(undefined1 (*) [16])*pauVar44);
        *(undefined1 (*) [16])*pauVar49 = auVar56;
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
        pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
        pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
        iVar36 = uVar48 + 8;
        uVar48 = uVar48 + 4;
      }
      if (uVar43 - uVar48 != 0 && (int)uVar48 <= (int)uVar43) {
        lVar47 = 0;
        do {
          auVar56 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar49 + lVar47 * 4)),auVar54,
                                    ZEXT416((uint)fVar121));
          auVar56 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar50 + lVar47 * 4)),auVar56,
                                    ZEXT416(*(uint *)(*pauVar44 + lVar47 * 4)));
          *(int *)(*pauVar49 + lVar47 * 4) = auVar56._0_4_;
          lVar47 = lVar47 + 1;
        } while (uVar43 - uVar48 != (int)lVar47);
      }
    }
  }
  else {
    uVar43 = bottom_top_blob->h;
    auVar54 = in_ZMM25._0_16_;
    if (iVar38 == 3) {
      uVar48 = bottom_top_blob->c;
      if (*(int *)(&this->field_0xd0 + (long)p_Var5) == iVar40) {
        if (0 < (int)uVar48) {
          uVar45 = iVar40 * iVar36;
          fVar121 = 1.0 / (float)iVar40;
          auVar66 = vbroadcastss_avx512f(ZEXT416((uint)fVar121));
          uVar52 = uVar45 & 0xfffffff0;
          local_48 = 0;
          auVar67 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar94._0_16_ = vxorps_avx512vl(auVar54,auVar54);
          auVar170._8_4_ = 0x80000000;
          auVar170._0_8_ = 0x8000000080000000;
          auVar170._12_4_ = 0x80000000;
          auVar173._8_4_ = 0xc0400000;
          auVar173._0_8_ = 0xc0400000c0400000;
          auVar173._12_4_ = 0xc0400000;
          auVar176._8_4_ = 0xc0400000;
          auVar176._0_8_ = 0xc0400000c0400000;
          auVar176._12_4_ = 0xc0400000;
          auVar176._16_4_ = 0xc0400000;
          auVar176._20_4_ = 0xc0400000;
          auVar176._24_4_ = 0xc0400000;
          auVar176._28_4_ = 0xc0400000;
          auVar178._8_4_ = 0x80000000;
          auVar178._0_8_ = 0x8000000080000000;
          auVar178._12_4_ = 0x80000000;
          auVar178._16_4_ = 0x80000000;
          auVar178._20_4_ = 0x80000000;
          auVar178._24_4_ = 0x80000000;
          auVar178._28_4_ = 0x80000000;
          auVar69 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
          auVar70 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
          auVar71 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          do {
            if (0 < (int)uVar43) {
              uVar51 = 0;
              do {
                auVar56 = in_ZMM17._0_16_;
                auVar54 = in_ZMM22._0_16_;
                pauVar49 = (undefined1 (*) [64])
                           ((long)bottom_top_blob->data +
                           (long)bottom_top_blob->w * uVar51 * bottom_top_blob->elemsize +
                           bottom_top_blob->cstep * local_48 * bottom_top_blob->elemsize);
                auVar57 = in_ZMM18._0_16_;
                pauVar37 = pauVar49;
                if ((int)uVar45 < 0x10) {
                  auVar57 = vxorps_avx512vl(auVar57,auVar57);
                  auVar179 = ZEXT1664(auVar57);
                  uVar39 = 0;
                }
                else {
                  auVar57 = vxorps_avx512vl(auVar57,auVar57);
                  auVar179 = ZEXT1664(auVar57);
                  iVar38 = 0x10;
                  do {
                    auVar179 = vaddps_avx512f(auVar179,*pauVar37);
                    pauVar37 = pauVar37 + 1;
                    iVar38 = iVar38 + 0x10;
                    uVar39 = uVar52;
                  } while (iVar38 <= (int)uVar45);
                }
                auVar59 = auVar179._0_16_;
                uVar41 = uVar39 | 8;
                auVar57 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
                auVar180 = ZEXT1664(auVar57);
                auVar61 = ZEXT1632(auVar57);
                while ((int)uVar41 <= (int)uVar45) {
                  auVar61 = vaddps_avx512vl(auVar180._0_32_,*(undefined1 (*) [32])*pauVar37);
                  auVar180 = ZEXT3264(auVar61);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                  uVar41 = uVar39 + 0x10;
                  uVar39 = uVar39 + 8;
                }
                iVar38 = uVar39 + 4;
                auVar57 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
                while (iVar38 <= (int)uVar45) {
                  auVar57 = vaddps_avx512vl(auVar57,*(undefined1 (*) [16])*pauVar37);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = uVar39 + 8;
                  uVar39 = uVar39 + 4;
                }
                auVar55 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
                in_ZMM19 = ZEXT1664(auVar55);
                fVar165 = 0.0;
                if ((int)uVar39 < (int)uVar45) {
                  auVar72 = vpbroadcastq_avx512f();
                  auVar54 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
                  uVar46 = 0;
                  auVar180 = ZEXT1664(auVar54);
                  do {
                    auVar108 = auVar180;
                    auVar180 = vpbroadcastq_avx512f();
                    auVar73 = vporq_avx512f(auVar180,auVar67);
                    auVar54 = auVar73._0_16_;
                    auVar180 = vporq_avx512f(auVar180,auVar68);
                    uVar19 = vpcmpuq_avx512f(auVar180,auVar72,2);
                    bVar30 = (byte)uVar19;
                    uVar19 = vpcmpuq_avx512f(auVar73,auVar72,2);
                    bVar31 = (byte)uVar19;
                    uVar53 = CONCAT11(bVar31,bVar30);
                    piVar1 = (int *)(*pauVar37 + uVar46 * 4);
                    auVar90._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                    auVar90._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                    auVar90._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                    auVar90._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                    auVar90._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                    auVar90._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                    auVar90._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                    auVar90._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                    auVar90._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                    auVar90._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                    auVar90._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                    auVar90._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                    auVar90._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                    auVar90._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                    auVar90._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                    auVar90._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                    auVar180 = vaddps_avx512f(auVar90,auVar108);
                    uVar46 = uVar46 + 0x10;
                  } while (((ulong)(~uVar39 + uVar45) + 0x10 & 0x1fffffff0) != uVar46);
                  auVar91._0_4_ =
                       (uint)(bVar30 & 1) * auVar180._0_4_ |
                       (uint)!(bool)(bVar30 & 1) * auVar108._0_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
                  auVar91._4_4_ = (uint)bVar6 * auVar180._4_4_ | (uint)!bVar6 * auVar108._4_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
                  auVar91._8_4_ = (uint)bVar6 * auVar180._8_4_ | (uint)!bVar6 * auVar108._8_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
                  auVar91._12_4_ = (uint)bVar6 * auVar180._12_4_ | (uint)!bVar6 * auVar108._12_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
                  auVar91._16_4_ = (uint)bVar6 * auVar180._16_4_ | (uint)!bVar6 * auVar108._16_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
                  auVar91._20_4_ = (uint)bVar6 * auVar180._20_4_ | (uint)!bVar6 * auVar108._20_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
                  auVar91._24_4_ = (uint)bVar6 * auVar180._24_4_ | (uint)!bVar6 * auVar108._24_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
                  auVar91._28_4_ = (uint)bVar6 * auVar180._28_4_ | (uint)!bVar6 * auVar108._28_4_;
                  auVar91._32_4_ =
                       (uint)(bVar31 & 1) * auVar180._32_4_ |
                       (uint)!(bool)(bVar31 & 1) * auVar108._32_4_;
                  bVar6 = (bool)(bVar31 >> 1 & 1);
                  auVar91._36_4_ = (uint)bVar6 * auVar180._36_4_ | (uint)!bVar6 * auVar108._36_4_;
                  bVar6 = (bool)(bVar31 >> 2 & 1);
                  auVar91._40_4_ = (uint)bVar6 * auVar180._40_4_ | (uint)!bVar6 * auVar108._40_4_;
                  bVar6 = (bool)(bVar31 >> 3 & 1);
                  auVar91._44_4_ = (uint)bVar6 * auVar180._44_4_ | (uint)!bVar6 * auVar108._44_4_;
                  bVar6 = (bool)(bVar31 >> 4 & 1);
                  auVar91._48_4_ = (uint)bVar6 * auVar180._48_4_ | (uint)!bVar6 * auVar108._48_4_;
                  bVar6 = (bool)(bVar31 >> 5 & 1);
                  auVar91._52_4_ = (uint)bVar6 * auVar180._52_4_ | (uint)!bVar6 * auVar108._52_4_;
                  bVar6 = (bool)(bVar31 >> 6 & 1);
                  auVar91._56_4_ = (uint)bVar6 * auVar180._56_4_ | (uint)!bVar6 * auVar108._56_4_;
                  auVar91._60_4_ =
                       (uint)(bVar31 >> 7) * auVar180._60_4_ |
                       (uint)!(bool)(bVar31 >> 7) * auVar108._60_4_;
                  auVar60 = vextractf64x4_avx512f(auVar91,1);
                  auVar180 = vaddps_avx512f(auVar91,ZEXT3264(auVar60));
                  auVar56 = vextractf32x4_avx512vl(auVar180._0_32_,1);
                  auVar55 = vaddps_avx512vl(auVar180._0_16_,auVar56);
                  auVar56 = vshufpd_avx512vl(auVar55,auVar55,1);
                  auVar55 = vaddps_avx512vl(auVar55,auVar56);
                  auVar55 = vhaddps_avx(auVar55,auVar55);
                  fVar165 = auVar55._0_4_;
                }
                in_ZMM20 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
                auVar54 = vpxord_avx512vl(auVar54,auVar54);
                auVar56 = vxorps_avx512vl(auVar56,auVar56);
                in_ZMM17 = ZEXT1664(auVar56);
                auVar56 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
                bVar6 = false;
                auVar55 = auVar61._0_16_;
                auVar180 = ZEXT1664(auVar56);
                if (iVar36 < 8) {
                  if (iVar36 == 1) {
                    auVar60 = vextractf64x4_avx512f(auVar179,1);
                    auVar179 = vaddps_avx512f(auVar179,ZEXT3264(auVar60));
                    auVar54 = vextractf32x4_avx512vl(auVar179._0_32_,1);
                    auVar54 = vaddps_avx512vl(auVar179._0_16_,auVar54);
                    auVar59 = vshufpd_avx512vl(auVar54,auVar54,1);
                    auVar54 = vaddps_avx512vl(auVar54,auVar59);
                    auVar54 = vhaddps_avx(auVar54,auVar54);
                    auVar56 = vextractf32x4_avx512vl(auVar61,1);
                    auVar56 = vaddps_avx512vl(auVar56,auVar55);
                    auVar58 = vshufps_avx512vl(auVar57,auVar56,0x41);
                    auVar56 = vshufps_avx512vl(auVar57,auVar56,0xeb);
                    auVar56 = vaddps_avx512vl(auVar56,auVar58);
                    auVar58 = vshufpd_avx512vl(auVar56,auVar56,1);
                    auVar56 = vaddps_avx512vl(auVar56,auVar58);
                    auVar56 = vhaddps_avx(auVar56,auVar56);
                    auVar54 = vmulss_avx512f(ZEXT416((uint)(fVar165 + auVar54._0_4_ + auVar56._0_4_)
                                                    ),ZEXT416((uint)fVar121));
                    in_ZMM19 = ZEXT1664(auVar54);
                    auVar92._32_32_ = auVar179._32_32_;
                    auVar92._0_32_ = vbroadcastss_avx512vl(auVar54);
                    auVar94._16_48_ = auVar92._16_48_;
                    auVar93._4_60_ = auVar94._4_60_;
                    auVar93._0_4_ = auVar92._0_4_;
                    in_ZMM17 = ZEXT1664(auVar93._0_16_);
                    bVar9 = true;
                    bVar6 = false;
                    auVar54 = auVar92._0_16_;
                  }
                  else {
                    bVar9 = false;
                    bVar8 = false;
                    if (iVar36 != 4) goto LAB_004e176f;
                    auVar60 = vextractf64x4_avx512f(auVar179,1);
                    auVar61 = vaddps_avx512vl(auVar179._0_32_,auVar61);
                    fVar165 = auVar61._4_4_ + auVar60._4_4_;
                    auVar146._0_4_ = auVar61._16_4_ + auVar60._16_4_ + auVar61._0_4_ + auVar60._0_4_
                    ;
                    auVar146._4_4_ = fVar165 + fVar165;
                    auVar146._8_4_ = auVar61._24_4_ + auVar60._24_4_ + auVar61._8_4_ + auVar60._8_4_
                    ;
                    auVar146._12_4_ =
                         auVar61._28_4_ + auVar60._28_4_ + auVar61._12_4_ + auVar60._12_4_;
                    auVar54 = vaddps_avx512vl(auVar146,auVar57);
                    auVar54 = vmulps_avx512vl(auVar54,auVar66._0_16_);
                    in_ZMM17 = ZEXT1664(auVar54);
                    auVar92._0_32_ = vinsertf32x4_avx512vl(ZEXT1632(auVar54),auVar54,1);
                    bVar6 = true;
                    bVar9 = false;
                    in_ZMM19 = in_ZMM17;
                  }
                  bVar8 = false;
                  auVar180 = ZEXT3264(auVar92._0_32_);
LAB_004e176f:
                  auVar61 = auVar180._0_32_;
                  auVar179 = vinsertf64x4_avx512f(auVar180,auVar61,1);
                  bVar10 = false;
                }
                else {
                  if (iVar36 == 8) {
                    auVar60 = vextractf64x4_avx512f(auVar179,1);
                    auVar61 = vaddps_avx512vl(auVar179._0_32_,auVar61);
                    auVar161._0_4_ = auVar61._0_4_ + auVar60._0_4_;
                    auVar161._4_4_ = auVar61._4_4_ + auVar60._4_4_;
                    auVar161._8_4_ = auVar61._8_4_ + auVar60._8_4_;
                    auVar161._12_4_ = auVar61._12_4_ + auVar60._12_4_;
                    auVar161._16_4_ = auVar61._16_4_ + auVar60._16_4_;
                    auVar161._20_4_ = auVar61._20_4_ + auVar60._20_4_;
                    auVar161._24_4_ = auVar61._24_4_ + auVar60._24_4_;
                    auVar161._28_4_ = auVar61._28_4_ + auVar60._28_4_;
                    auVar61 = vmulps_avx512vl(auVar161,auVar66._0_32_);
                    in_ZMM17 = ZEXT3264(auVar61);
                    auVar54 = vbroadcastss_avx512vl(auVar61._0_16_);
                    bVar8 = true;
                    bVar6 = false;
                    in_ZMM19 = ZEXT1664(auVar61._0_16_);
                    bVar9 = false;
                    auVar180 = in_ZMM17;
                    goto LAB_004e176f;
                  }
                  bVar9 = false;
                  bVar8 = false;
                  if (iVar36 != 0x10) goto LAB_004e176f;
                  auVar179 = vmulps_avx512f(auVar179,auVar66);
                  auVar61 = vbroadcastss_avx512vl(auVar179._0_16_);
                  bVar10 = true;
                  bVar6 = false;
                  bVar9 = false;
                  auVar54 = auVar61._0_16_;
                  bVar8 = false;
                  in_ZMM17 = auVar179;
                  in_ZMM19 = auVar179;
                }
                auVar120 = auVar179._16_48_;
                pauVar37 = pauVar49;
                if ((int)uVar45 < 0x10) {
                  auVar56 = vxorps_avx512vl(auVar55,auVar55);
                  in_ZMM21 = ZEXT1664(auVar56);
                  uVar39 = 0;
                }
                else {
                  auVar56 = vxorps_avx512vl(auVar55,auVar55);
                  in_ZMM21 = ZEXT1664(auVar56);
                  iVar38 = 0x10;
                  do {
                    auVar180 = vsubps_avx512f(*pauVar37,auVar179);
                    in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar180,auVar180);
                    auVar120 = in_ZMM21._16_48_;
                    pauVar37 = pauVar37 + 1;
                    iVar38 = iVar38 + 0x10;
                    uVar39 = uVar52;
                  } while (iVar38 <= (int)uVar45);
                }
                uVar41 = uVar39 | 8;
                auVar95._0_16_ = vxorps_avx512vl(auVar57,auVar57);
                auVar95._16_48_ = auVar120;
                in_ZMM23 = ZEXT1664(auVar95._0_16_);
                auVar60 = auVar120._16_32_;
                while ((int)uVar41 <= (int)uVar45) {
                  auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar61);
                  auVar95._0_32_ = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar60,auVar60);
                  in_ZMM23 = ZEXT3264(auVar95._0_32_);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                  uVar41 = uVar39 + 0x10;
                  auVar60 = auVar95._32_32_;
                  uVar39 = uVar39 + 8;
                }
                iVar38 = uVar39 + 4;
                auVar56 = vxorps_avx512vl(auVar61._0_16_,auVar61._0_16_);
                while (iVar38 <= (int)uVar45) {
                  auVar57 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,auVar54);
                  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar57,auVar57);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = uVar39 + 8;
                  uVar39 = uVar39 + 4;
                }
                fVar165 = 0.0;
                if ((int)uVar39 < (int)uVar45) {
                  auVar179 = vpbroadcastq_avx512f();
                  auVar180 = vbroadcastss_avx512f(in_ZMM19._0_16_);
                  auVar59 = auVar180._0_16_;
                  auVar54 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
                  uVar46 = 0;
                  in_ZMM26 = ZEXT1664(auVar54);
                  do {
                    auVar108 = in_ZMM26;
                    auVar72 = vpbroadcastq_avx512f();
                    auVar73 = vporq_avx512f(auVar72,auVar67);
                    auVar72 = vporq_avx512f(auVar72,auVar68);
                    uVar19 = vpcmpuq_avx512f(auVar72,auVar179,2);
                    bVar30 = (byte)uVar19;
                    uVar19 = vpcmpuq_avx512f(auVar73,auVar179,2);
                    bVar31 = (byte)uVar19;
                    uVar53 = CONCAT11(bVar31,bVar30);
                    piVar1 = (int *)(*pauVar37 + uVar46 * 4);
                    auVar96._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                    auVar96._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                    auVar96._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                    auVar96._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                    auVar96._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                    auVar96._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                    auVar96._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                    auVar96._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                    auVar96._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                    auVar96._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                    auVar96._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                    auVar96._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                    auVar96._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                    auVar96._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                    auVar96._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                    auVar96._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                    auVar72 = vsubps_avx512f(auVar96,auVar180);
                    in_ZMM26 = vfmadd213ps_avx512f(auVar72,auVar72,auVar108);
                    uVar46 = uVar46 + 0x10;
                  } while (((ulong)(~uVar39 + uVar45) + 0x10 & 0x1fffffff0) != uVar46);
                  auVar97._0_4_ =
                       (uint)(bVar30 & 1) * in_ZMM26._0_4_ |
                       (uint)!(bool)(bVar30 & 1) * auVar108._0_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                  auVar97._4_4_ = (uint)bVar7 * in_ZMM26._4_4_ | (uint)!bVar7 * auVar108._4_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
                  auVar97._8_4_ = (uint)bVar7 * in_ZMM26._8_4_ | (uint)!bVar7 * auVar108._8_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                  auVar97._12_4_ = (uint)bVar7 * in_ZMM26._12_4_ | (uint)!bVar7 * auVar108._12_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
                  auVar97._16_4_ = (uint)bVar7 * in_ZMM26._16_4_ | (uint)!bVar7 * auVar108._16_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
                  auVar97._20_4_ = (uint)bVar7 * in_ZMM26._20_4_ | (uint)!bVar7 * auVar108._20_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
                  auVar97._24_4_ = (uint)bVar7 * in_ZMM26._24_4_ | (uint)!bVar7 * auVar108._24_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
                  auVar97._28_4_ = (uint)bVar7 * in_ZMM26._28_4_ | (uint)!bVar7 * auVar108._28_4_;
                  auVar97._32_4_ =
                       (uint)(bVar31 & 1) * in_ZMM26._32_4_ |
                       (uint)!(bool)(bVar31 & 1) * auVar108._32_4_;
                  bVar7 = (bool)(bVar31 >> 1 & 1);
                  auVar97._36_4_ = (uint)bVar7 * in_ZMM26._36_4_ | (uint)!bVar7 * auVar108._36_4_;
                  bVar7 = (bool)(bVar31 >> 2 & 1);
                  auVar97._40_4_ = (uint)bVar7 * in_ZMM26._40_4_ | (uint)!bVar7 * auVar108._40_4_;
                  bVar7 = (bool)(bVar31 >> 3 & 1);
                  auVar97._44_4_ = (uint)bVar7 * in_ZMM26._44_4_ | (uint)!bVar7 * auVar108._44_4_;
                  bVar7 = (bool)(bVar31 >> 4 & 1);
                  auVar97._48_4_ = (uint)bVar7 * in_ZMM26._48_4_ | (uint)!bVar7 * auVar108._48_4_;
                  bVar7 = (bool)(bVar31 >> 5 & 1);
                  auVar97._52_4_ = (uint)bVar7 * in_ZMM26._52_4_ | (uint)!bVar7 * auVar108._52_4_;
                  bVar7 = (bool)(bVar31 >> 6 & 1);
                  auVar97._56_4_ = (uint)bVar7 * in_ZMM26._56_4_ | (uint)!bVar7 * auVar108._56_4_;
                  auVar97._60_4_ =
                       (uint)(bVar31 >> 7) * in_ZMM26._60_4_ |
                       (uint)!(bool)(bVar31 >> 7) * auVar108._60_4_;
                  auVar61 = vextractf64x4_avx512f(auVar97,1);
                  auVar179 = vaddps_avx512f(auVar97,ZEXT3264(auVar61));
                  auVar60 = auVar179._32_32_;
                  auVar147._0_4_ = auVar179._0_4_ + auVar179._16_4_;
                  auVar147._4_4_ = auVar179._4_4_ + auVar179._20_4_;
                  auVar147._8_4_ = auVar179._8_4_ + auVar179._24_4_;
                  auVar147._12_4_ = auVar179._12_4_ + auVar179._28_4_;
                  auVar54 = vshufpd_avx(auVar147,auVar147,1);
                  auVar148._0_4_ = auVar147._0_4_ + auVar54._0_4_;
                  auVar148._4_4_ = auVar147._4_4_ + auVar54._4_4_;
                  auVar148._8_4_ = auVar147._8_4_ + auVar54._8_4_;
                  auVar148._12_4_ = auVar147._12_4_ + auVar54._12_4_;
                  auVar54 = vhaddps_avx(auVar148,auVar148);
                  fVar165 = auVar54._0_4_;
                }
                if (bVar10) {
                  in_ZMM18 = vmulps_avx512f(in_ZMM21,auVar66);
                  auVar60 = in_ZMM18._32_32_;
                }
                else {
                  auVar54 = vxorps_avx512vl(auVar59,auVar59);
                  in_ZMM18 = ZEXT1664(auVar54);
                }
                auVar98._0_32_ = vextractf64x4_avx512f(in_ZMM21,1);
                auVar98._32_32_ = auVar60;
                auVar120 = auVar98._16_48_;
                in_ZMM22 = ZEXT3264(auVar98._0_32_);
                if (bVar8) {
                  auVar61 = vaddps_avx512vl(in_ZMM21._0_32_,in_ZMM23._0_32_);
                  auVar61 = vaddps_avx512vl(auVar61,auVar98._0_32_);
                  in_ZMM23 = ZEXT3264(auVar61);
                  auVar61 = vmulps_avx512vl(auVar61,auVar66._0_32_);
                  in_ZMM18 = vinsertf64x4_avx512f(in_ZMM18,auVar61,0);
                  auVar120 = in_ZMM18._16_48_;
                }
                if (bVar6) {
                  auVar61 = vaddps_avx512vl(in_ZMM21._0_32_,in_ZMM23._0_32_);
                  auVar61 = vaddps_avx512vl(auVar61,auVar98._0_32_);
                  in_ZMM23 = ZEXT3264(auVar61);
                  auVar54 = vextractf32x4_avx512vl(auVar61,1);
                  auVar54 = vaddps_avx512vl(auVar61._0_16_,auVar54);
                  auVar56 = vaddps_avx512vl(auVar54,auVar56);
                  auVar54 = vmulps_avx512vl(auVar56,auVar66._0_16_);
                  in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar54,0);
                  auVar120 = in_ZMM18._16_48_;
                }
                in_ZMM24 = ZEXT1664(auVar56);
                if (bVar9) {
                  auVar179 = vaddps_avx512f(in_ZMM21,in_ZMM22);
                  auVar100._16_48_ = auVar179._16_48_;
                  auVar54 = vextractf32x4_avx512vl(auVar179._0_32_,1);
                  auVar54 = vaddps_avx512vl(auVar179._0_16_,auVar54);
                  auVar57 = vshufpd_avx512vl(auVar54,auVar54,1);
                  auVar54 = vaddps_avx512vl(auVar54,auVar57);
                  auVar54 = vhaddps_avx(auVar54,auVar54);
                  auVar57 = vextractf32x4_avx512vl(in_ZMM23._0_32_,1);
                  auVar57 = vaddps_avx512vl(auVar57,in_ZMM23._0_16_);
                  auVar59 = vshufps_avx512vl(auVar57,auVar56,0x11);
                  auVar56 = vshufps_avx512vl(auVar57,auVar56,0xbb);
                  auVar56 = vaddps_avx512vl(auVar56,auVar59);
                  auVar57 = vshufpd_avx512vl(auVar56,auVar56,1);
                  in_ZMM21 = ZEXT1664(auVar57);
                  auVar56 = vaddps_avx512vl(auVar56,auVar57);
                  auVar56 = vhaddps_avx(auVar56,auVar56);
                  auVar100._0_16_ = in_ZMM18._0_16_;
                  auVar99._4_60_ = auVar100._4_60_;
                  auVar99._0_4_ = (fVar165 + auVar54._0_4_ + auVar56._0_4_) * fVar121;
                  in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar99._0_16_,0);
                  auVar120 = in_ZMM18._16_48_;
                }
                auVar54 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
                if (iVar36 < 8) {
                  auVar56 = in_ZMM18._0_16_;
                  if (iVar36 == 1) {
                    auVar57 = vaddss_avx512f(auVar56,auVar54);
                    auVar54 = vrsqrtss_avx(auVar57,auVar57);
                    auVar57 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar57._0_4_ * auVar54._0_4_)),
                                                  auVar54,ZEXT416(0xc0400000));
                    fVar165 = auVar54._0_4_ * -0.5 * auVar57._0_4_;
                    auVar102._16_48_ = auVar120;
                    auVar102._0_16_ = auVar56;
                    auVar101._4_60_ = auVar102._4_60_;
                    auVar101._0_4_ = fVar165;
                    in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar101._0_16_,0);
                    auVar104._16_48_ = in_ZMM18._16_48_;
                    auVar54 = vxorps_avx512vl(in_ZMM19._0_16_,auVar170);
                    auVar104._0_16_ = in_ZMM17._0_16_;
                    auVar103._4_60_ = auVar104._4_60_;
                    auVar103._0_4_ = fVar165 * auVar54._0_4_;
                    in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar103._0_16_,0);
                  }
                  else if (iVar36 == 4) {
                    auVar54 = vbroadcastss_avx512vl(auVar54);
                    auVar56 = vaddps_avx512vl(auVar56,auVar54);
                    auVar54 = vrsqrtps_avx(auVar56);
                    auVar149._0_4_ = auVar56._0_4_ * auVar54._0_4_;
                    auVar149._4_4_ = auVar56._4_4_ * auVar54._4_4_;
                    auVar149._8_4_ = auVar56._8_4_ * auVar54._8_4_;
                    auVar149._12_4_ = auVar56._12_4_ * auVar54._12_4_;
                    auVar56 = vfmadd213ps_fma(auVar149,auVar54,auVar173);
                    auVar150._0_4_ = auVar54._0_4_ * -0.5 * auVar56._0_4_;
                    auVar150._4_4_ = auVar54._4_4_ * -0.5 * auVar56._4_4_;
                    auVar150._8_4_ = auVar54._8_4_ * -0.5 * auVar56._8_4_;
                    auVar150._12_4_ = auVar54._12_4_ * -0.5 * auVar56._12_4_;
                    auVar54 = vxorps_avx512vl(in_ZMM17._0_16_,auVar170);
                    auVar167._0_4_ = auVar150._0_4_ * auVar54._0_4_;
                    auVar167._4_4_ = auVar150._4_4_ * auVar54._4_4_;
                    auVar167._8_4_ = auVar150._8_4_ * auVar54._8_4_;
                    auVar167._12_4_ = auVar150._12_4_ * auVar54._12_4_;
                    in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar150,0);
                    in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar167,0);
                  }
                }
                else if (iVar36 == 8) {
                  auVar61 = vbroadcastss_avx512vl(auVar54);
                  auVar60 = vaddps_avx512vl(in_ZMM18._0_32_,auVar61);
                  auVar61 = vrsqrtps_avx(auVar60);
                  auVar34._4_4_ = auVar60._4_4_ * auVar61._4_4_;
                  auVar34._0_4_ = auVar60._0_4_ * auVar61._0_4_;
                  auVar34._8_4_ = auVar60._8_4_ * auVar61._8_4_;
                  auVar34._12_4_ = auVar60._12_4_ * auVar61._12_4_;
                  auVar34._16_4_ = auVar60._16_4_ * auVar61._16_4_;
                  auVar34._20_4_ = auVar60._20_4_ * auVar61._20_4_;
                  auVar34._24_4_ = auVar60._24_4_ * auVar61._24_4_;
                  auVar34._28_4_ = auVar60._28_4_;
                  auVar54 = vfmadd213ps_fma(auVar34,auVar61,auVar176);
                  auVar162._0_4_ = auVar61._0_4_ * -0.5 * auVar54._0_4_;
                  auVar162._4_4_ = auVar61._4_4_ * -0.5 * auVar54._4_4_;
                  auVar162._8_4_ = auVar61._8_4_ * -0.5 * auVar54._8_4_;
                  auVar162._12_4_ = auVar61._12_4_ * -0.5 * auVar54._12_4_;
                  auVar162._16_4_ = auVar61._16_4_ * -0.5 * 0.0;
                  auVar162._20_4_ = auVar61._20_4_ * -0.5 * 0.0;
                  auVar162._24_4_ = auVar61._24_4_ * -0.5 * 0.0;
                  auVar162._28_4_ = 0;
                  auVar61 = vxorps_avx512vl(in_ZMM17._0_32_,auVar178);
                  auVar35._4_4_ = auVar162._4_4_ * auVar61._4_4_;
                  auVar35._0_4_ = auVar162._0_4_ * auVar61._0_4_;
                  auVar35._8_4_ = auVar162._8_4_ * auVar61._8_4_;
                  auVar35._12_4_ = auVar162._12_4_ * auVar61._12_4_;
                  auVar35._16_4_ = auVar162._16_4_ * auVar61._16_4_;
                  auVar35._20_4_ = auVar162._20_4_ * auVar61._20_4_;
                  auVar35._24_4_ = auVar162._24_4_ * auVar61._24_4_;
                  auVar35._28_4_ = auVar61._28_4_;
                  in_ZMM18 = vinsertf64x4_avx512f(in_ZMM18,auVar162,0);
                  in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar35,0);
                }
                else if (iVar36 == 0x10) {
                  auVar179 = vbroadcastss_avx512f(auVar54);
                  auVar179 = vaddps_avx512f(in_ZMM18,auVar179);
                  auVar180 = vrsqrt14ps_avx512f(auVar179);
                  auVar179 = vmulps_avx512f(auVar179,auVar180);
                  auVar179 = vfmadd213ps_avx512f(auVar179,auVar180,auVar69);
                  auVar180 = vmulps_avx512f(auVar180,auVar70);
                  in_ZMM18 = vmulps_avx512f(auVar180,auVar179);
                  auVar179 = vxorps_avx512dq(in_ZMM17,auVar71);
                  in_ZMM17 = vmulps_avx512f(in_ZMM18,auVar179);
                }
                auVar56 = in_ZMM18._0_16_;
                auVar60 = in_ZMM18._0_32_;
                auVar54 = in_ZMM17._0_16_;
                auVar61 = in_ZMM17._0_32_;
                if (*(int *)(&this->field_0xd8 + (long)pp_Var4[-3]) == 0) {
                  auVar57 = auVar54;
                  auVar59 = auVar56;
                  if (!bVar6) {
                    auVar59 = vbroadcastss_avx512vl(auVar56);
                    auVar57 = vbroadcastss_avx512vl(auVar54);
                  }
                  in_ZMM20 = ZEXT1664(auVar57);
                  in_ZMM19 = ZEXT1664(auVar59);
                  if (!bVar8) {
                    auVar60 = vinsertf32x4_avx512vl(ZEXT1632(auVar59),auVar59,1);
                    auVar61 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
                  }
                  in_ZMM22 = ZEXT3264(auVar61);
                  in_ZMM21 = ZEXT3264(auVar60);
                  in_ZMM23 = in_ZMM17;
                  auVar179 = in_ZMM18;
                  if (!bVar10) {
                    auVar179 = vinsertf64x4_avx512f(in_ZMM21,auVar60,1);
                    in_ZMM23 = vinsertf64x4_avx512f(in_ZMM22,auVar61,1);
                  }
                  uVar39 = 0;
                  if (0xf < (int)uVar45) {
                    iVar38 = 0x10;
                    do {
                      auVar180 = vfmadd132ps_avx512f(*pauVar49,in_ZMM23,auVar179);
                      *pauVar49 = auVar180;
                      pauVar49 = pauVar49 + 1;
                      iVar38 = iVar38 + 0x10;
                      uVar39 = uVar52;
                    } while (iVar38 <= (int)uVar45);
                  }
                  uVar41 = uVar39 | 8;
                  while ((int)uVar41 <= (int)uVar45) {
                    auVar180._0_32_ =
                         vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar61,auVar60);
                    *(undefined1 (*) [32])*pauVar49 = auVar180._0_32_;
                    pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                    uVar41 = uVar39 + 0x10;
                    uVar39 = uVar39 + 8;
                  }
                  iVar38 = uVar39 + 4;
                  while (iVar38 <= (int)uVar45) {
                    auVar55 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar57,auVar59);
                    *(undefined1 (*) [16])*pauVar49 = auVar55;
                    pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                    iVar38 = uVar39 + 8;
                    uVar39 = uVar39 + 4;
                  }
                  if ((int)uVar39 < (int)uVar45) {
                    auVar179 = vpbroadcastq_avx512f();
                    in_ZMM18 = vbroadcastss_avx512f(auVar56);
                    in_ZMM17 = vbroadcastss_avx512f(auVar54);
                    uVar46 = 0;
                    do {
                      auVar180 = vpbroadcastq_avx512f();
                      in_ZMM19 = vporq_avx512f(auVar180,auVar67);
                      auVar180 = vporq_avx512f(auVar180,auVar68);
                      uVar19 = vpcmpuq_avx512f(auVar180,auVar179,2);
                      bVar30 = (byte)uVar19;
                      uVar19 = vpcmpuq_avx512f(in_ZMM19,auVar179,2);
                      bVar31 = (byte)uVar19;
                      uVar53 = CONCAT11(bVar31,bVar30);
                      piVar1 = (int *)(*pauVar49 + uVar46 * 4);
                      auVar106._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                      auVar106._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                      auVar106._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                      auVar106._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                      auVar106._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                      auVar106._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                      auVar106._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                      auVar106._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                      auVar106._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                      auVar106._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                      auVar106._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                      auVar106._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                      auVar106._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                      auVar106._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                      auVar106._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                      auVar106._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                      auVar72 = vfmadd213ps_avx512f(auVar106,in_ZMM18,in_ZMM17);
                      auVar180 = *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4);
                      auVar107._0_4_ =
                           (uint)(bVar30 & 1) * auVar72._0_4_ |
                           (uint)!(bool)(bVar30 & 1) * auVar180._0_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
                      auVar107._4_4_ = (uint)bVar6 * auVar72._4_4_ | (uint)!bVar6 * auVar180._4_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
                      auVar107._8_4_ = (uint)bVar6 * auVar72._8_4_ | (uint)!bVar6 * auVar180._8_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
                      auVar107._12_4_ =
                           (uint)bVar6 * auVar72._12_4_ | (uint)!bVar6 * auVar180._12_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
                      auVar107._16_4_ =
                           (uint)bVar6 * auVar72._16_4_ | (uint)!bVar6 * auVar180._16_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
                      auVar107._20_4_ =
                           (uint)bVar6 * auVar72._20_4_ | (uint)!bVar6 * auVar180._20_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
                      auVar107._24_4_ =
                           (uint)bVar6 * auVar72._24_4_ | (uint)!bVar6 * auVar180._24_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
                      auVar107._28_4_ =
                           (uint)bVar6 * auVar72._28_4_ | (uint)!bVar6 * auVar180._28_4_;
                      auVar107._32_4_ =
                           (uint)(bVar31 & 1) * auVar72._32_4_ |
                           (uint)!(bool)(bVar31 & 1) * auVar180._32_4_;
                      bVar6 = (bool)(bVar31 >> 1 & 1);
                      auVar107._36_4_ =
                           (uint)bVar6 * auVar72._36_4_ | (uint)!bVar6 * auVar180._36_4_;
                      bVar6 = (bool)(bVar31 >> 2 & 1);
                      auVar107._40_4_ =
                           (uint)bVar6 * auVar72._40_4_ | (uint)!bVar6 * auVar180._40_4_;
                      bVar6 = (bool)(bVar31 >> 3 & 1);
                      auVar107._44_4_ =
                           (uint)bVar6 * auVar72._44_4_ | (uint)!bVar6 * auVar180._44_4_;
                      bVar6 = (bool)(bVar31 >> 4 & 1);
                      auVar107._48_4_ =
                           (uint)bVar6 * auVar72._48_4_ | (uint)!bVar6 * auVar180._48_4_;
                      bVar6 = (bool)(bVar31 >> 5 & 1);
                      auVar107._52_4_ =
                           (uint)bVar6 * auVar72._52_4_ | (uint)!bVar6 * auVar180._52_4_;
                      bVar6 = (bool)(bVar31 >> 6 & 1);
                      auVar107._56_4_ =
                           (uint)bVar6 * auVar72._56_4_ | (uint)!bVar6 * auVar180._56_4_;
                      auVar107._60_4_ =
                           (uint)(bVar31 >> 7) * auVar72._60_4_ |
                           (uint)!(bool)(bVar31 >> 7) * auVar180._60_4_;
                      *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4) = auVar107;
                      uVar46 = uVar46 + 0x10;
                    } while (((ulong)(~uVar39 + uVar45) + 0x10 & 0x1fffffff0) != uVar46);
                  }
                }
                else {
                  pauVar37 = pauVar44;
                  pauVar42 = pauVar50;
                  if ((bool)(bVar10 & 0xf < (int)uVar45)) {
                    iVar38 = 0x10;
                    do {
                      auVar179 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar42));
                      auVar180 = vfmadd132ps_avx512f(*pauVar49,in_ZMM17,in_ZMM18);
                      uVar3 = *(undefined4 *)*pauVar37;
                      auVar28._4_4_ = uVar3;
                      auVar28._0_4_ = uVar3;
                      auVar28._8_4_ = uVar3;
                      auVar28._12_4_ = uVar3;
                      auVar28._16_4_ = uVar3;
                      auVar28._20_4_ = uVar3;
                      auVar28._24_4_ = uVar3;
                      auVar28._28_4_ = uVar3;
                      auVar28._32_4_ = uVar3;
                      auVar28._36_4_ = uVar3;
                      auVar28._40_4_ = uVar3;
                      auVar28._44_4_ = uVar3;
                      auVar28._48_4_ = uVar3;
                      auVar28._52_4_ = uVar3;
                      auVar28._56_4_ = uVar3;
                      auVar28._60_4_ = uVar3;
                      auVar179 = vfmadd213ps_avx512f(auVar180,auVar179,auVar28);
                      *pauVar49 = auVar179;
                      pauVar49 = pauVar49 + 1;
                      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                      iVar38 = iVar38 + 0x10;
                    } while (iVar38 <= (int)uVar45);
                  }
                  if (bVar8) {
                    iVar38 = 8;
                    if (0xf < (int)uVar45) {
                      auVar179 = vinsertf64x4_avx512f(in_ZMM18,auVar60,1);
                      in_ZMM19 = vinsertf64x4_avx512f(in_ZMM17,auVar61,1);
                      iVar40 = 0x10;
                      do {
                        in_ZMM22 = ZEXT464(*(uint *)(*pauVar37 + 4));
                        auVar180 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar42),auVar122,
                                                     ZEXT464(*(uint *)(*pauVar42 + 4)));
                        in_ZMM21 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar122,in_ZMM22);
                        auVar72 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar179);
                        in_ZMM20 = vfmadd213ps_avx512f(auVar72,auVar180,in_ZMM21);
                        *pauVar49 = in_ZMM20;
                        pauVar49 = pauVar49 + 1;
                        pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                        iVar40 = iVar40 + 0x10;
                        iVar38 = uVar52 + 8;
                      } while (iVar40 <= (int)uVar45);
                    }
                    for (; iVar38 <= (int)uVar45; iVar38 = iVar38 + 8) {
                      uVar3 = *(undefined4 *)*pauVar42;
                      auVar163._4_4_ = uVar3;
                      auVar163._0_4_ = uVar3;
                      auVar163._8_4_ = uVar3;
                      auVar163._12_4_ = uVar3;
                      auVar163._16_4_ = uVar3;
                      auVar163._20_4_ = uVar3;
                      auVar163._24_4_ = uVar3;
                      auVar163._28_4_ = uVar3;
                      auVar180._0_32_ =
                           vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar61,auVar60);
                      uVar3 = *(undefined4 *)*pauVar37;
                      auVar25._4_4_ = uVar3;
                      auVar25._0_4_ = uVar3;
                      auVar25._8_4_ = uVar3;
                      auVar25._12_4_ = uVar3;
                      auVar25._16_4_ = uVar3;
                      auVar25._20_4_ = uVar3;
                      auVar25._24_4_ = uVar3;
                      auVar25._28_4_ = uVar3;
                      auVar180._0_32_ = vfmadd213ps_avx512vl(auVar180._0_32_,auVar163,auVar25);
                      *(undefined1 (*) [32])*pauVar49 = auVar180._0_32_;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                    }
                  }
                  if (bVar6) {
                    uVar39 = 0;
                    if (0xf < (int)uVar45) {
                      auVar179 = vinsertf64x4_avx512f(in_ZMM18,auVar60,1);
                      auVar179 = vpermpd_avx512f(auVar179,0x44);
                      auVar180 = vinsertf64x4_avx512f(in_ZMM17,auVar61,1);
                      in_ZMM19 = vpermpd_avx512f(auVar180,0x44);
                      iVar38 = 0x10;
                      do {
                        auVar180 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 8)));
                        auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 0xc)));
                        auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar42),
                                                   ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                        auVar62 = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                        auVar180 = vinsertf64x4_avx512f(auVar180,auVar62,0);
                        auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                        in_ZMM22 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                        auVar105._0_48_ = auVar180._0_48_;
                        auVar105._48_8_ = auVar72._48_8_;
                        auVar105._56_8_ = auVar72._56_8_;
                        in_ZMM23 = ZEXT464(*(uint *)(*pauVar37 + 4));
                        auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                                   ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                        auVar180._0_32_ = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                        auVar180 = vinsertf64x4_avx512f(auVar73,auVar180._0_32_,0);
                        in_ZMM20._0_48_ = auVar180._0_48_;
                        in_ZMM20._48_8_ = in_ZMM22._48_8_;
                        in_ZMM20._56_8_ = in_ZMM22._56_8_;
                        auVar180 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar179);
                        in_ZMM21 = vfmadd213ps_avx512f(auVar180,auVar105,in_ZMM20);
                        *pauVar49 = in_ZMM21;
                        pauVar49 = pauVar49 + 1;
                        pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                        iVar38 = iVar38 + 0x10;
                        uVar39 = uVar52;
                      } while (iVar38 <= (int)uVar45);
                    }
                    if ((int)(uVar39 | 8) <= (int)uVar45) {
                      auVar60 = vpermpd_avx512vl(auVar60,0x44);
                      auVar61 = vpermpd_avx512vl(auVar61,0x44);
                      in_ZMM19 = ZEXT3264(auVar61);
                      uVar41 = uVar39;
                      do {
                        auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar42),
                                                   ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                        auVar59 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                                   ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                        auVar180._0_32_ = vpermpd_avx2(ZEXT1632(auVar57),0x50);
                        auVar62 = vpermpd_avx512vl(ZEXT1632(auVar59),0x50);
                        in_ZMM20 = ZEXT3264(auVar62);
                        auVar63 = vfmadd132ps_avx512vl
                                            (*(undefined1 (*) [32])*pauVar49,auVar61,auVar60);
                        auVar180._0_32_ = vfmadd213ps_avx512vl(auVar63,auVar180._0_32_,auVar62);
                        in_ZMM21 = ZEXT3264(auVar180._0_32_);
                        *(undefined1 (*) [32])*pauVar49 = auVar180._0_32_;
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                        pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                        uVar39 = uVar41 + 8;
                        iVar38 = uVar41 + 0x10;
                        uVar41 = uVar39;
                      } while (iVar38 <= (int)uVar45);
                    }
                    while (uVar39 = uVar39 + 4, (int)uVar39 <= (int)uVar45) {
                      uVar3 = *(undefined4 *)*pauVar42;
                      auVar151._4_4_ = uVar3;
                      auVar151._0_4_ = uVar3;
                      auVar151._8_4_ = uVar3;
                      auVar151._12_4_ = uVar3;
                      auVar57 = vfmadd132ps_avx512vl
                                          (*(undefined1 (*) [16])*pauVar49,auVar54,auVar56);
                      uVar3 = *(undefined4 *)*pauVar37;
                      auVar21._4_4_ = uVar3;
                      auVar21._0_4_ = uVar3;
                      auVar21._8_4_ = uVar3;
                      auVar21._12_4_ = uVar3;
                      auVar57 = vfmadd213ps_avx512vl(auVar57,auVar151,auVar21);
                      *(undefined1 (*) [16])*pauVar49 = auVar57;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                    }
                  }
                  if (bVar9) {
                    in_ZMM19 = vbroadcastss_avx512f(auVar56);
                    in_ZMM20 = vbroadcastss_avx512f(auVar54);
                    uVar39 = 0;
                    if (0xf < (int)uVar45) {
                      iVar38 = 0x10;
                      do {
                        auVar179 = vfmadd132ps_avx512f(*pauVar49,in_ZMM20,in_ZMM19);
                        auVar179 = vfmadd213ps_avx512f(auVar179,*pauVar42,*pauVar37);
                        *pauVar49 = auVar179;
                        pauVar49 = pauVar49 + 1;
                        pauVar42 = pauVar42 + 1;
                        pauVar37 = pauVar37 + 1;
                        iVar38 = iVar38 + 0x10;
                        uVar39 = uVar52;
                      } while (iVar38 <= (int)uVar45);
                    }
                    uVar41 = uVar39 | 8;
                    while ((int)uVar41 <= (int)uVar45) {
                      auVar61 = vfmadd132ps_avx512vl
                                          (*(undefined1 (*) [32])*pauVar49,in_ZMM20._0_32_,
                                           in_ZMM19._0_32_);
                      auVar57 = vfmadd213ps_fma(auVar61,*(undefined1 (*) [32])*pauVar42,
                                                *(undefined1 (*) [32])*pauVar37);
                      *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar57);
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                      uVar41 = uVar39 + 0x10;
                      uVar39 = uVar39 + 8;
                    }
                    iVar38 = uVar39 + 4;
                    while (iVar38 <= (int)uVar45) {
                      auVar57 = vfmadd132ps_avx512vl
                                          (*(undefined1 (*) [16])*pauVar49,in_ZMM20._0_16_,
                                           in_ZMM19._0_16_);
                      auVar57 = vfmadd213ps_fma(auVar57,*(undefined1 (*) [16])*pauVar42,
                                                *(undefined1 (*) [16])*pauVar37);
                      *(undefined1 (*) [16])*pauVar49 = auVar57;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                      iVar38 = uVar39 + 8;
                      uVar39 = uVar39 + 4;
                    }
                    if (uVar45 - uVar39 != 0 && (int)uVar39 <= (int)uVar45) {
                      lVar47 = 0;
                      do {
                        auVar57 = vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar47 * 4)),
                                                      auVar54,auVar56);
                        auVar57 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar42 + lVar47 * 4)),auVar57
                                                  ,ZEXT416(*(uint *)(*pauVar37 + lVar47 * 4)));
                        *(int *)(*pauVar49 + lVar47 * 4) = auVar57._0_4_;
                        lVar47 = lVar47 + 1;
                      } while (uVar45 - uVar39 != (int)lVar47);
                    }
                  }
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar43);
            }
            local_48 = local_48 + 1;
          } while (local_48 != uVar48);
        }
      }
      else if (0 < (int)uVar48) {
        uVar52 = uVar43 * iVar40 * iVar36;
        fVar121 = 1.0 / (float)(int)(uVar43 * iVar40);
        auVar66 = vbroadcastss_avx512f(ZEXT416((uint)fVar121));
        uVar43 = uVar52 & 0xfffffff0;
        uVar51 = 0;
        auVar67 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar179._0_16_ = vxorps_avx512vl(auVar54,auVar54);
        auVar171._8_4_ = 0x80000000;
        auVar171._0_8_ = 0x8000000080000000;
        auVar171._12_4_ = 0x80000000;
        auVar174._8_4_ = 0xc0400000;
        auVar174._0_8_ = 0xc0400000c0400000;
        auVar174._12_4_ = 0xc0400000;
        auVar61._8_4_ = 0xc0400000;
        auVar61._0_8_ = 0xc0400000c0400000;
        auVar61._12_4_ = 0xc0400000;
        auVar61._16_4_ = 0xc0400000;
        auVar61._20_4_ = 0xc0400000;
        auVar61._24_4_ = 0xc0400000;
        auVar61._28_4_ = 0xc0400000;
        auVar60._8_4_ = 0x80000000;
        auVar60._0_8_ = 0x8000000080000000;
        auVar60._12_4_ = 0x80000000;
        auVar60._16_4_ = 0x80000000;
        auVar60._20_4_ = 0x80000000;
        auVar60._24_4_ = 0x80000000;
        auVar60._28_4_ = 0x80000000;
        auVar69 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
        auVar70 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
        auVar71 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        do {
          auVar57 = in_ZMM17._0_16_;
          auVar56 = in_ZMM22._0_16_;
          pauVar49 = (undefined1 (*) [64])
                     (bottom_top_blob->cstep * uVar51 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar54 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          auVar180 = ZEXT1664(auVar54);
          pauVar37 = pauVar49;
          uVar45 = 0;
          if (0xf < (int)uVar52) {
            iVar38 = 0x10;
            do {
              auVar180 = vaddps_avx512f(auVar180,*pauVar37);
              pauVar37 = pauVar37 + 1;
              iVar38 = iVar38 + 0x10;
              uVar45 = uVar43;
            } while (iVar38 <= (int)uVar52);
          }
          auVar59 = auVar180._0_16_;
          uVar39 = uVar45 | 8;
          auVar54 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          auVar72 = ZEXT1664(auVar54);
          auVar62 = ZEXT1632(auVar54);
          while ((int)uVar39 <= (int)uVar52) {
            auVar62 = vaddps_avx512vl(auVar72._0_32_,*(undefined1 (*) [32])*pauVar37);
            auVar72 = ZEXT3264(auVar62);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
            uVar39 = uVar45 + 0x10;
            uVar45 = uVar45 + 8;
          }
          iVar38 = uVar45 + 4;
          auVar54 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          while (iVar38 <= (int)uVar52) {
            auVar54 = vaddps_avx512vl(auVar54,*(undefined1 (*) [16])*pauVar37);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
            iVar38 = uVar45 + 8;
            uVar45 = uVar45 + 4;
          }
          auVar55 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar55);
          fVar165 = 0.0;
          if ((int)uVar45 < (int)uVar52) {
            auVar73 = vpbroadcastq_avx512f();
            auVar56 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
            uVar46 = 0;
            auVar72 = ZEXT1664(auVar56);
            do {
              auVar109 = auVar72;
              auVar72 = vpbroadcastq_avx512f();
              auVar108 = vporq_avx512f(auVar72,auVar67);
              auVar56 = auVar108._0_16_;
              auVar72 = vporq_avx512f(auVar72,auVar68);
              uVar19 = vpcmpuq_avx512f(auVar72,auVar73,2);
              bVar30 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar108,auVar73,2);
              bVar31 = (byte)uVar19;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar37 + uVar46 * 4);
              auVar72._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar72._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar72._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar72._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar72._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar72._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar72._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar72._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar72._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar72._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar72._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar72._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar72._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar72._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar72._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar72._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar72 = vaddps_avx512f(auVar72,auVar109);
              uVar46 = uVar46 + 0x10;
            } while (((ulong)(~uVar45 + uVar52) + 0x10 & 0x1fffffff0) != uVar46);
            auVar73._0_4_ =
                 (uint)(bVar30 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar109._0_4_;
            bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
            auVar73._4_4_ = (uint)bVar6 * auVar72._4_4_ | (uint)!bVar6 * auVar109._4_4_;
            bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
            auVar73._8_4_ = (uint)bVar6 * auVar72._8_4_ | (uint)!bVar6 * auVar109._8_4_;
            bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
            auVar73._12_4_ = (uint)bVar6 * auVar72._12_4_ | (uint)!bVar6 * auVar109._12_4_;
            bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
            auVar73._16_4_ = (uint)bVar6 * auVar72._16_4_ | (uint)!bVar6 * auVar109._16_4_;
            bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
            auVar73._20_4_ = (uint)bVar6 * auVar72._20_4_ | (uint)!bVar6 * auVar109._20_4_;
            bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
            auVar73._24_4_ = (uint)bVar6 * auVar72._24_4_ | (uint)!bVar6 * auVar109._24_4_;
            bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
            auVar73._28_4_ = (uint)bVar6 * auVar72._28_4_ | (uint)!bVar6 * auVar109._28_4_;
            auVar73._32_4_ =
                 (uint)(bVar31 & 1) * auVar72._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar109._32_4_;
            bVar6 = (bool)(bVar31 >> 1 & 1);
            auVar73._36_4_ = (uint)bVar6 * auVar72._36_4_ | (uint)!bVar6 * auVar109._36_4_;
            bVar6 = (bool)(bVar31 >> 2 & 1);
            auVar73._40_4_ = (uint)bVar6 * auVar72._40_4_ | (uint)!bVar6 * auVar109._40_4_;
            bVar6 = (bool)(bVar31 >> 3 & 1);
            auVar73._44_4_ = (uint)bVar6 * auVar72._44_4_ | (uint)!bVar6 * auVar109._44_4_;
            bVar6 = (bool)(bVar31 >> 4 & 1);
            auVar73._48_4_ = (uint)bVar6 * auVar72._48_4_ | (uint)!bVar6 * auVar109._48_4_;
            bVar6 = (bool)(bVar31 >> 5 & 1);
            auVar73._52_4_ = (uint)bVar6 * auVar72._52_4_ | (uint)!bVar6 * auVar109._52_4_;
            bVar6 = (bool)(bVar31 >> 6 & 1);
            auVar73._56_4_ = (uint)bVar6 * auVar72._56_4_ | (uint)!bVar6 * auVar109._56_4_;
            auVar73._60_4_ =
                 (uint)(bVar31 >> 7) * auVar72._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar109._60_4_
            ;
            auVar63 = vextractf64x4_avx512f(auVar73,1);
            auVar72 = vaddps_avx512f(auVar73,ZEXT3264(auVar63));
            auVar57 = vextractf32x4_avx512vl(auVar72._0_32_,1);
            auVar55 = vaddps_avx512vl(auVar72._0_16_,auVar57);
            auVar57 = vshufpd_avx512vl(auVar55,auVar55,1);
            auVar55 = vaddps_avx512vl(auVar55,auVar57);
            auVar55 = vhaddps_avx(auVar55,auVar55);
            fVar165 = auVar55._0_4_;
          }
          in_ZMM20 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
          auVar56 = vpxord_avx512vl(auVar56,auVar56);
          in_ZMM22 = ZEXT1664(auVar56);
          auVar56 = vxorps_avx512vl(auVar57,auVar57);
          in_ZMM17 = ZEXT1664(auVar56);
          auVar56 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          bVar6 = false;
          auVar57 = auVar62._0_16_;
          auVar72 = ZEXT1664(auVar56);
          if (iVar36 < 8) {
            if (iVar36 == 1) {
              auVar63 = vextractf64x4_avx512f(auVar180,1);
              auVar180 = vaddps_avx512f(auVar180,ZEXT3264(auVar63));
              auVar56 = vextractf32x4_avx512vl(auVar180._0_32_,1);
              auVar56 = vaddps_avx512vl(auVar180._0_16_,auVar56);
              auVar59 = vshufpd_avx512vl(auVar56,auVar56,1);
              auVar56 = vaddps_avx512vl(auVar56,auVar59);
              auVar56 = vhaddps_avx(auVar56,auVar56);
              auVar55 = vextractf32x4_avx512vl(auVar62,1);
              auVar55 = vaddps_avx512vl(auVar55,auVar57);
              auVar58 = vshufps_avx512vl(auVar54,auVar55,0x41);
              auVar55 = vshufps_avx512vl(auVar54,auVar55,0xeb);
              auVar55 = vaddps_avx512vl(auVar55,auVar58);
              auVar58 = vshufpd_avx512vl(auVar55,auVar55,1);
              auVar55 = vaddps_avx512vl(auVar55,auVar58);
              auVar55 = vhaddps_avx(auVar55,auVar55);
              auVar56 = vmulss_avx512f(ZEXT416((uint)(fVar165 + auVar56._0_4_ + auVar55._0_4_)),
                                       ZEXT416((uint)fVar121));
              in_ZMM19 = ZEXT1664(auVar56);
              auVar180._0_32_ = vbroadcastss_avx512vl(auVar56);
              auVar179._16_48_ = auVar180._16_48_;
              auVar108._4_60_ = auVar179._4_60_;
              auVar108._0_4_ = auVar180._0_4_;
              in_ZMM17 = ZEXT1664(auVar108._0_16_);
              bVar9 = true;
              bVar6 = false;
              auVar56 = auVar180._0_16_;
            }
            else {
              bVar9 = false;
              bVar8 = false;
              if (iVar36 != 4) goto LAB_004e23e1;
              auVar63 = vextractf64x4_avx512f(auVar180,1);
              auVar180._0_32_ = vaddps_avx512vl(auVar180._0_32_,auVar62);
              fVar165 = auVar180._4_4_ + auVar63._4_4_;
              auVar152._0_4_ = auVar180._16_4_ + auVar63._16_4_ + auVar180._0_4_ + auVar63._0_4_;
              auVar152._4_4_ = fVar165 + fVar165;
              auVar152._8_4_ = auVar180._24_4_ + auVar63._24_4_ + auVar180._8_4_ + auVar63._8_4_;
              auVar152._12_4_ = auVar180._28_4_ + auVar63._28_4_ + auVar180._12_4_ + auVar63._12_4_;
              auVar56 = vaddps_avx512vl(auVar152,auVar54);
              auVar56 = vmulps_avx512vl(auVar56,auVar66._0_16_);
              in_ZMM17 = ZEXT1664(auVar56);
              auVar180._0_32_ = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar56,1);
              bVar6 = true;
              bVar9 = false;
              in_ZMM19 = in_ZMM17;
            }
            in_ZMM22 = ZEXT1664(auVar56);
            bVar8 = false;
            auVar72 = ZEXT3264(auVar180._0_32_);
LAB_004e23e1:
            auVar62 = auVar72._0_32_;
            auVar180 = vinsertf64x4_avx512f(auVar72,auVar62,1);
            bVar10 = false;
          }
          else {
            if (iVar36 == 8) {
              auVar63 = vextractf64x4_avx512f(auVar180,1);
              auVar180._0_32_ = vaddps_avx512vl(auVar180._0_32_,auVar62);
              auVar62._0_4_ = auVar180._0_4_ + auVar63._0_4_;
              auVar62._4_4_ = auVar180._4_4_ + auVar63._4_4_;
              auVar62._8_4_ = auVar180._8_4_ + auVar63._8_4_;
              auVar62._12_4_ = auVar180._12_4_ + auVar63._12_4_;
              auVar62._16_4_ = auVar180._16_4_ + auVar63._16_4_;
              auVar62._20_4_ = auVar180._20_4_ + auVar63._20_4_;
              auVar62._24_4_ = auVar180._24_4_ + auVar63._24_4_;
              auVar62._28_4_ = auVar180._28_4_ + auVar63._28_4_;
              auVar180._0_32_ = vmulps_avx512vl(auVar62,auVar66._0_32_);
              in_ZMM17 = ZEXT3264(auVar180._0_32_);
              auVar56 = vbroadcastss_avx512vl(auVar180._0_16_);
              in_ZMM22 = ZEXT1664(auVar56);
              bVar8 = true;
              bVar6 = false;
              in_ZMM19 = ZEXT1664(auVar180._0_16_);
              bVar9 = false;
              auVar72 = in_ZMM17;
              goto LAB_004e23e1;
            }
            bVar9 = false;
            bVar8 = false;
            if (iVar36 != 0x10) goto LAB_004e23e1;
            auVar180 = vmulps_avx512f(auVar180,auVar66);
            auVar62 = vbroadcastss_avx512vl(auVar180._0_16_);
            bVar10 = true;
            bVar6 = false;
            bVar9 = false;
            in_ZMM22 = ZEXT1664(auVar62._0_16_);
            bVar8 = false;
            in_ZMM17 = auVar180;
            in_ZMM19 = auVar180;
          }
          auVar120 = auVar180._16_48_;
          pauVar37 = pauVar49;
          if ((int)uVar52 < 0x10) {
            auVar56 = vxorps_avx512vl(auVar57,auVar57);
            in_ZMM21 = ZEXT1664(auVar56);
            uVar45 = 0;
          }
          else {
            auVar56 = vxorps_avx512vl(auVar57,auVar57);
            in_ZMM21 = ZEXT1664(auVar56);
            iVar38 = 0x10;
            do {
              auVar72 = vsubps_avx512f(*pauVar37,auVar180);
              in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar72,auVar72);
              auVar120 = in_ZMM21._16_48_;
              pauVar37 = pauVar37 + 1;
              iVar38 = iVar38 + 0x10;
              uVar45 = uVar43;
            } while (iVar38 <= (int)uVar52);
          }
          uVar39 = uVar45 | 8;
          auVar109._0_16_ = vxorps_avx512vl(auVar54,auVar54);
          auVar109._16_48_ = auVar120;
          in_ZMM23 = ZEXT1664(auVar109._0_16_);
          while ((int)uVar39 <= (int)uVar52) {
            auVar180._0_32_ = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar62);
            auVar109._0_32_ = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar180._0_32_,auVar180._0_32_);
            auVar120 = auVar109._16_48_;
            in_ZMM23 = ZEXT3264(auVar109._0_32_);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
            uVar39 = uVar45 + 0x10;
            uVar45 = uVar45 + 8;
          }
          iVar38 = uVar45 + 4;
          auVar54 = vxorps_avx512vl(auVar62._0_16_,auVar62._0_16_);
          while (iVar38 <= (int)uVar52) {
            auVar56 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,in_ZMM22._0_16_);
            auVar54 = vfmadd231ps_avx512vl(auVar54,auVar56,auVar56);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
            iVar38 = uVar45 + 8;
            uVar45 = uVar45 + 4;
          }
          fVar165 = 0.0;
          if ((int)uVar45 < (int)uVar52) {
            auVar180 = vpbroadcastq_avx512f();
            auVar72 = vbroadcastss_avx512f(in_ZMM19._0_16_);
            auVar59 = auVar72._0_16_;
            auVar56 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
            uVar46 = 0;
            in_ZMM26 = ZEXT1664(auVar56);
            do {
              auVar109 = in_ZMM26;
              auVar73 = vpbroadcastq_avx512f();
              auVar108 = vporq_avx512f(auVar73,auVar67);
              auVar73 = vporq_avx512f(auVar73,auVar68);
              uVar19 = vpcmpuq_avx512f(auVar73,auVar180,2);
              bVar30 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar108,auVar180,2);
              bVar31 = (byte)uVar19;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar37 + uVar46 * 4);
              auVar110._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar110._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar110._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar110._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar110._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar110._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar110._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar110._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar110._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar110._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar110._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar110._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar110._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar110._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar110._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar110._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar73 = vsubps_avx512f(auVar110,auVar72);
              in_ZMM26 = vfmadd213ps_avx512f(auVar73,auVar73,auVar109);
              uVar46 = uVar46 + 0x10;
            } while (((ulong)(~uVar45 + uVar52) + 0x10 & 0x1fffffff0) != uVar46);
            in_ZMM22._0_4_ =
                 (uint)(bVar30 & 1) * in_ZMM26._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar109._0_4_;
            bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
            in_ZMM22._4_4_ = (uint)bVar7 * in_ZMM26._4_4_ | (uint)!bVar7 * auVar109._4_4_;
            bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
            in_ZMM22._8_4_ = (uint)bVar7 * in_ZMM26._8_4_ | (uint)!bVar7 * auVar109._8_4_;
            bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
            in_ZMM22._12_4_ = (uint)bVar7 * in_ZMM26._12_4_ | (uint)!bVar7 * auVar109._12_4_;
            bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
            in_ZMM22._16_4_ = (uint)bVar7 * in_ZMM26._16_4_ | (uint)!bVar7 * auVar109._16_4_;
            bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
            in_ZMM22._20_4_ = (uint)bVar7 * in_ZMM26._20_4_ | (uint)!bVar7 * auVar109._20_4_;
            bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
            in_ZMM22._24_4_ = (uint)bVar7 * in_ZMM26._24_4_ | (uint)!bVar7 * auVar109._24_4_;
            bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
            in_ZMM22._28_4_ = (uint)bVar7 * in_ZMM26._28_4_ | (uint)!bVar7 * auVar109._28_4_;
            in_ZMM22._32_4_ =
                 (uint)(bVar31 & 1) * in_ZMM26._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar109._32_4_;
            bVar7 = (bool)(bVar31 >> 1 & 1);
            in_ZMM22._36_4_ = (uint)bVar7 * in_ZMM26._36_4_ | (uint)!bVar7 * auVar109._36_4_;
            bVar7 = (bool)(bVar31 >> 2 & 1);
            in_ZMM22._40_4_ = (uint)bVar7 * in_ZMM26._40_4_ | (uint)!bVar7 * auVar109._40_4_;
            bVar7 = (bool)(bVar31 >> 3 & 1);
            in_ZMM22._44_4_ = (uint)bVar7 * in_ZMM26._44_4_ | (uint)!bVar7 * auVar109._44_4_;
            bVar7 = (bool)(bVar31 >> 4 & 1);
            in_ZMM22._48_4_ = (uint)bVar7 * in_ZMM26._48_4_ | (uint)!bVar7 * auVar109._48_4_;
            bVar7 = (bool)(bVar31 >> 5 & 1);
            in_ZMM22._52_4_ = (uint)bVar7 * in_ZMM26._52_4_ | (uint)!bVar7 * auVar109._52_4_;
            bVar7 = (bool)(bVar31 >> 6 & 1);
            in_ZMM22._56_4_ = (uint)bVar7 * in_ZMM26._56_4_ | (uint)!bVar7 * auVar109._56_4_;
            in_ZMM22._60_4_ =
                 (uint)(bVar31 >> 7) * in_ZMM26._60_4_ |
                 (uint)!(bool)(bVar31 >> 7) * auVar109._60_4_;
            auVar180._0_32_ = vextractf64x4_avx512f(in_ZMM22,1);
            auVar180 = vaddps_avx512f(in_ZMM22,ZEXT3264(auVar180._0_32_));
            auVar120 = auVar180._16_48_;
            auVar153._0_4_ = auVar180._0_4_ + auVar180._16_4_;
            auVar153._4_4_ = auVar180._4_4_ + auVar180._20_4_;
            auVar153._8_4_ = auVar180._8_4_ + auVar180._24_4_;
            auVar153._12_4_ = auVar180._12_4_ + auVar180._28_4_;
            auVar56 = vshufpd_avx(auVar153,auVar153,1);
            auVar154._0_4_ = auVar153._0_4_ + auVar56._0_4_;
            auVar154._4_4_ = auVar153._4_4_ + auVar56._4_4_;
            auVar154._8_4_ = auVar153._8_4_ + auVar56._8_4_;
            auVar154._12_4_ = auVar153._12_4_ + auVar56._12_4_;
            auVar56 = vhaddps_avx(auVar154,auVar154);
            fVar165 = auVar56._0_4_;
          }
          if (bVar10) {
            in_ZMM18 = vmulps_avx512f(in_ZMM21,auVar66);
            auVar120 = in_ZMM18._16_48_;
          }
          else {
            auVar56 = vxorps_avx512vl(auVar59,auVar59);
            in_ZMM18 = ZEXT1664(auVar56);
          }
          if (bVar8) {
            auVar180._0_32_ = vextractf64x4_avx512f(in_ZMM21,1);
            auVar62 = vaddps_avx512vl(in_ZMM21._0_32_,in_ZMM23._0_32_);
            in_ZMM22 = ZEXT3264(auVar62);
            auVar180._0_32_ = vaddps_avx512vl(auVar62,auVar180._0_32_);
            in_ZMM23 = ZEXT3264(auVar180._0_32_);
            auVar180._0_32_ = vmulps_avx512vl(auVar180._0_32_,auVar66._0_32_);
            in_ZMM18 = vinsertf64x4_avx512f(in_ZMM18,auVar180._0_32_,0);
            auVar120 = in_ZMM18._16_48_;
          }
          if (bVar6) {
            auVar180._0_32_ = vextractf64x4_avx512f(in_ZMM21,1);
            auVar62 = vaddps_avx512vl(in_ZMM21._0_32_,in_ZMM23._0_32_);
            in_ZMM22 = ZEXT3264(auVar62);
            auVar180._0_32_ = vaddps_avx512vl(auVar62,auVar180._0_32_);
            in_ZMM23 = ZEXT3264(auVar180._0_32_);
            auVar56 = vextractf32x4_avx512vl(auVar180._0_32_,1);
            auVar56 = vaddps_avx512vl(auVar180._0_16_,auVar56);
            auVar54 = vaddps_avx512vl(auVar56,auVar54);
            auVar56 = vmulps_avx512vl(auVar54,auVar66._0_16_);
            in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar56,0);
            auVar120 = in_ZMM18._16_48_;
          }
          in_ZMM24 = ZEXT1664(auVar54);
          if (bVar9) {
            auVar180._0_32_ = vextractf64x4_avx512f(in_ZMM21,1);
            auVar180 = vaddps_avx512f(in_ZMM21,ZEXT3264(auVar180._0_32_));
            auVar112._16_48_ = auVar180._16_48_;
            auVar56 = vextractf32x4_avx512vl(auVar180._0_32_,1);
            auVar56 = vaddps_avx512vl(auVar180._0_16_,auVar56);
            auVar57 = vshufpd_avx512vl(auVar56,auVar56,1);
            auVar56 = vaddps_avx512vl(auVar56,auVar57);
            auVar56 = vhaddps_avx(auVar56,auVar56);
            auVar57 = vextractf32x4_avx512vl(in_ZMM23._0_32_,1);
            auVar57 = vaddps_avx512vl(auVar57,in_ZMM23._0_16_);
            auVar59 = vshufps_avx512vl(auVar57,auVar54,0x11);
            auVar54 = vshufps_avx512vl(auVar57,auVar54,0xbb);
            auVar54 = vaddps_avx512vl(auVar54,auVar59);
            auVar57 = vshufpd_avx512vl(auVar54,auVar54,1);
            in_ZMM21 = ZEXT1664(auVar57);
            auVar54 = vaddps_avx512vl(auVar54,auVar57);
            auVar54 = vhaddps_avx(auVar54,auVar54);
            auVar112._0_16_ = in_ZMM18._0_16_;
            auVar111._4_60_ = auVar112._4_60_;
            auVar111._0_4_ = (fVar165 + auVar56._0_4_ + auVar54._0_4_) * fVar121;
            in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar111._0_16_,0);
            auVar120 = in_ZMM18._16_48_;
          }
          auVar54 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
          if (iVar36 < 8) {
            auVar56 = in_ZMM18._0_16_;
            if (iVar36 == 1) {
              auVar57 = vaddss_avx512f(auVar56,auVar54);
              auVar54 = vrsqrtss_avx(auVar57,auVar57);
              auVar57 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar57._0_4_ * auVar54._0_4_)),auVar54,
                                            ZEXT416(0xc0400000));
              fVar165 = auVar54._0_4_ * -0.5 * auVar57._0_4_;
              auVar114._16_48_ = auVar120;
              auVar114._0_16_ = auVar56;
              auVar113._4_60_ = auVar114._4_60_;
              auVar113._0_4_ = fVar165;
              in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar113._0_16_,0);
              auVar116._16_48_ = in_ZMM18._16_48_;
              auVar54 = vxorps_avx512vl(in_ZMM19._0_16_,auVar171);
              auVar116._0_16_ = in_ZMM17._0_16_;
              auVar115._4_60_ = auVar116._4_60_;
              auVar115._0_4_ = fVar165 * auVar54._0_4_;
              in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar115._0_16_,0);
            }
            else if (iVar36 == 4) {
              auVar54 = vbroadcastss_avx512vl(auVar54);
              auVar56 = vaddps_avx512vl(auVar56,auVar54);
              auVar54 = vrsqrtps_avx(auVar56);
              auVar155._0_4_ = auVar56._0_4_ * auVar54._0_4_;
              auVar155._4_4_ = auVar56._4_4_ * auVar54._4_4_;
              auVar155._8_4_ = auVar56._8_4_ * auVar54._8_4_;
              auVar155._12_4_ = auVar56._12_4_ * auVar54._12_4_;
              auVar56 = vfmadd213ps_fma(auVar155,auVar54,auVar174);
              auVar156._0_4_ = auVar54._0_4_ * -0.5 * auVar56._0_4_;
              auVar156._4_4_ = auVar54._4_4_ * -0.5 * auVar56._4_4_;
              auVar156._8_4_ = auVar54._8_4_ * -0.5 * auVar56._8_4_;
              auVar156._12_4_ = auVar54._12_4_ * -0.5 * auVar56._12_4_;
              auVar54 = vxorps_avx512vl(in_ZMM17._0_16_,auVar171);
              auVar168._0_4_ = auVar156._0_4_ * auVar54._0_4_;
              auVar168._4_4_ = auVar156._4_4_ * auVar54._4_4_;
              auVar168._8_4_ = auVar156._8_4_ * auVar54._8_4_;
              auVar168._12_4_ = auVar156._12_4_ * auVar54._12_4_;
              in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar156,0);
              in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar168,0);
            }
          }
          else if (iVar36 == 8) {
            auVar180._0_32_ = vbroadcastss_avx512vl(auVar54);
            auVar62 = vaddps_avx512vl(in_ZMM18._0_32_,auVar180._0_32_);
            auVar180._0_32_ = vrsqrtps_avx(auVar62);
            auVar63._4_4_ = auVar62._4_4_ * auVar180._4_4_;
            auVar63._0_4_ = auVar62._0_4_ * auVar180._0_4_;
            auVar63._8_4_ = auVar62._8_4_ * auVar180._8_4_;
            auVar63._12_4_ = auVar62._12_4_ * auVar180._12_4_;
            auVar63._16_4_ = auVar62._16_4_ * auVar180._16_4_;
            auVar63._20_4_ = auVar62._20_4_ * auVar180._20_4_;
            auVar63._24_4_ = auVar62._24_4_ * auVar180._24_4_;
            auVar63._28_4_ = auVar62._28_4_;
            auVar54 = vfmadd213ps_fma(auVar63,auVar180._0_32_,auVar61);
            auVar65._0_4_ = auVar180._0_4_ * -0.5 * auVar54._0_4_;
            auVar65._4_4_ = auVar180._4_4_ * -0.5 * auVar54._4_4_;
            auVar65._8_4_ = auVar180._8_4_ * -0.5 * auVar54._8_4_;
            auVar65._12_4_ = auVar180._12_4_ * -0.5 * auVar54._12_4_;
            auVar65._16_4_ = auVar180._16_4_ * -0.5 * 0.0;
            auVar65._20_4_ = auVar180._20_4_ * -0.5 * 0.0;
            auVar65._24_4_ = auVar180._24_4_ * -0.5 * 0.0;
            auVar65._28_4_ = 0;
            auVar180._0_32_ = vxorps_avx512vl(in_ZMM17._0_32_,auVar60);
            auVar64._4_4_ = auVar65._4_4_ * auVar180._4_4_;
            auVar64._0_4_ = auVar65._0_4_ * auVar180._0_4_;
            auVar64._8_4_ = auVar65._8_4_ * auVar180._8_4_;
            auVar64._12_4_ = auVar65._12_4_ * auVar180._12_4_;
            auVar64._16_4_ = auVar65._16_4_ * auVar180._16_4_;
            auVar64._20_4_ = auVar65._20_4_ * auVar180._20_4_;
            auVar64._24_4_ = auVar65._24_4_ * auVar180._24_4_;
            auVar64._28_4_ = auVar180._28_4_;
            in_ZMM18 = vinsertf64x4_avx512f(in_ZMM18,auVar65,0);
            in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar64,0);
          }
          else if (iVar36 == 0x10) {
            auVar180 = vbroadcastss_avx512f(auVar54);
            auVar180 = vaddps_avx512f(in_ZMM18,auVar180);
            auVar72 = vrsqrt14ps_avx512f(auVar180);
            auVar180 = vmulps_avx512f(auVar180,auVar72);
            auVar180 = vfmadd213ps_avx512f(auVar180,auVar72,auVar69);
            auVar72 = vmulps_avx512f(auVar72,auVar70);
            in_ZMM18 = vmulps_avx512f(auVar72,auVar180);
            auVar180 = vxorps_avx512dq(in_ZMM17,auVar71);
            in_ZMM17 = vmulps_avx512f(in_ZMM18,auVar180);
          }
          auVar56 = in_ZMM18._0_16_;
          auVar62 = in_ZMM18._0_32_;
          auVar54 = in_ZMM17._0_16_;
          auVar63 = in_ZMM17._0_32_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var4[-3]) == 0) {
            auVar57 = auVar54;
            auVar59 = auVar56;
            if (!bVar6) {
              auVar59 = vbroadcastss_avx512vl(auVar56);
              auVar57 = vbroadcastss_avx512vl(auVar54);
            }
            in_ZMM20 = ZEXT1664(auVar57);
            in_ZMM19 = ZEXT1664(auVar59);
            if (!bVar8) {
              auVar62 = vinsertf32x4_avx512vl(ZEXT1632(auVar59),auVar59,1);
              auVar63 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
            }
            in_ZMM22 = ZEXT3264(auVar63);
            in_ZMM21 = ZEXT3264(auVar62);
            in_ZMM23 = in_ZMM17;
            auVar180 = in_ZMM18;
            if (!bVar10) {
              auVar180 = vinsertf64x4_avx512f(in_ZMM21,auVar62,1);
              in_ZMM23 = vinsertf64x4_avx512f(in_ZMM22,auVar63,1);
            }
            uVar45 = 0;
            if (0xf < (int)uVar52) {
              iVar38 = 0x10;
              do {
                auVar72 = vfmadd132ps_avx512f(*pauVar49,in_ZMM23,auVar180);
                *pauVar49 = auVar72;
                pauVar49 = pauVar49 + 1;
                iVar38 = iVar38 + 0x10;
                uVar45 = uVar43;
              } while (iVar38 <= (int)uVar52);
            }
            uVar39 = uVar45 | 8;
            while ((int)uVar39 <= (int)uVar52) {
              auVar180._0_32_ =
                   vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar63,auVar62);
              *(undefined1 (*) [32])*pauVar49 = auVar180._0_32_;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              uVar39 = uVar45 + 0x10;
              uVar45 = uVar45 + 8;
            }
            iVar38 = uVar45 + 4;
            while (iVar38 <= (int)uVar52) {
              auVar55 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar57,auVar59);
              *(undefined1 (*) [16])*pauVar49 = auVar55;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              iVar38 = uVar45 + 8;
              uVar45 = uVar45 + 4;
            }
            if ((int)uVar45 < (int)uVar52) {
              auVar180 = vpbroadcastq_avx512f();
              in_ZMM18 = vbroadcastss_avx512f(auVar56);
              in_ZMM17 = vbroadcastss_avx512f(auVar54);
              uVar46 = 0;
              do {
                auVar72 = vpbroadcastq_avx512f();
                in_ZMM19 = vporq_avx512f(auVar72,auVar67);
                auVar72 = vporq_avx512f(auVar72,auVar68);
                uVar19 = vpcmpuq_avx512f(auVar72,auVar180,2);
                bVar30 = (byte)uVar19;
                uVar19 = vpcmpuq_avx512f(in_ZMM19,auVar180,2);
                bVar31 = (byte)uVar19;
                uVar53 = CONCAT11(bVar31,bVar30);
                piVar1 = (int *)(*pauVar49 + uVar46 * 4);
                auVar118._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                auVar118._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                auVar118._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                auVar118._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                auVar118._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                auVar118._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                auVar118._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                auVar118._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                auVar118._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                auVar118._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                auVar118._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                auVar118._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                auVar118._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                auVar118._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                auVar118._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                auVar118._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                auVar73 = vfmadd213ps_avx512f(auVar118,in_ZMM18,in_ZMM17);
                auVar72 = *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4);
                auVar119._0_4_ =
                     (uint)(bVar30 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar72._0_4_;
                bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
                auVar119._4_4_ = (uint)bVar6 * auVar73._4_4_ | (uint)!bVar6 * auVar72._4_4_;
                bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
                auVar119._8_4_ = (uint)bVar6 * auVar73._8_4_ | (uint)!bVar6 * auVar72._8_4_;
                bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
                auVar119._12_4_ = (uint)bVar6 * auVar73._12_4_ | (uint)!bVar6 * auVar72._12_4_;
                bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
                auVar119._16_4_ = (uint)bVar6 * auVar73._16_4_ | (uint)!bVar6 * auVar72._16_4_;
                bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
                auVar119._20_4_ = (uint)bVar6 * auVar73._20_4_ | (uint)!bVar6 * auVar72._20_4_;
                bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
                auVar119._24_4_ = (uint)bVar6 * auVar73._24_4_ | (uint)!bVar6 * auVar72._24_4_;
                bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
                auVar119._28_4_ = (uint)bVar6 * auVar73._28_4_ | (uint)!bVar6 * auVar72._28_4_;
                auVar119._32_4_ =
                     (uint)(bVar31 & 1) * auVar73._32_4_ |
                     (uint)!(bool)(bVar31 & 1) * auVar72._32_4_;
                bVar6 = (bool)(bVar31 >> 1 & 1);
                auVar119._36_4_ = (uint)bVar6 * auVar73._36_4_ | (uint)!bVar6 * auVar72._36_4_;
                bVar6 = (bool)(bVar31 >> 2 & 1);
                auVar119._40_4_ = (uint)bVar6 * auVar73._40_4_ | (uint)!bVar6 * auVar72._40_4_;
                bVar6 = (bool)(bVar31 >> 3 & 1);
                auVar119._44_4_ = (uint)bVar6 * auVar73._44_4_ | (uint)!bVar6 * auVar72._44_4_;
                bVar6 = (bool)(bVar31 >> 4 & 1);
                auVar119._48_4_ = (uint)bVar6 * auVar73._48_4_ | (uint)!bVar6 * auVar72._48_4_;
                bVar6 = (bool)(bVar31 >> 5 & 1);
                auVar119._52_4_ = (uint)bVar6 * auVar73._52_4_ | (uint)!bVar6 * auVar72._52_4_;
                bVar6 = (bool)(bVar31 >> 6 & 1);
                auVar119._56_4_ = (uint)bVar6 * auVar73._56_4_ | (uint)!bVar6 * auVar72._56_4_;
                auVar119._60_4_ =
                     (uint)(bVar31 >> 7) * auVar73._60_4_ |
                     (uint)!(bool)(bVar31 >> 7) * auVar72._60_4_;
                *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4) = auVar119;
                uVar46 = uVar46 + 0x10;
              } while (((ulong)(~uVar45 + uVar52) + 0x10 & 0x1fffffff0) != uVar46);
            }
          }
          else {
            pauVar37 = pauVar44;
            pauVar42 = pauVar50;
            if (bVar10 && 0xf < (int)uVar52) {
              iVar38 = 0x10;
              do {
                auVar180 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar42));
                auVar72 = vfmadd132ps_avx512f(*pauVar49,in_ZMM17,in_ZMM18);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar29._4_4_ = uVar3;
                auVar29._0_4_ = uVar3;
                auVar29._8_4_ = uVar3;
                auVar29._12_4_ = uVar3;
                auVar29._16_4_ = uVar3;
                auVar29._20_4_ = uVar3;
                auVar29._24_4_ = uVar3;
                auVar29._28_4_ = uVar3;
                auVar29._32_4_ = uVar3;
                auVar29._36_4_ = uVar3;
                auVar29._40_4_ = uVar3;
                auVar29._44_4_ = uVar3;
                auVar29._48_4_ = uVar3;
                auVar29._52_4_ = uVar3;
                auVar29._56_4_ = uVar3;
                auVar29._60_4_ = uVar3;
                auVar180 = vfmadd213ps_avx512f(auVar72,auVar180,auVar29);
                *pauVar49 = auVar180;
                pauVar49 = pauVar49 + 1;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                iVar38 = iVar38 + 0x10;
              } while (iVar38 <= (int)uVar52);
            }
            if (bVar8) {
              iVar38 = 8;
              if (0xf < (int)uVar52) {
                auVar180 = vinsertf64x4_avx512f(in_ZMM18,auVar62,1);
                in_ZMM19 = vinsertf64x4_avx512f(in_ZMM17,auVar63,1);
                iVar40 = 0x10;
                do {
                  in_ZMM22 = ZEXT464(*(uint *)(*pauVar37 + 4));
                  auVar72 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar42),auVar122,
                                              ZEXT464(*(uint *)(*pauVar42 + 4)));
                  in_ZMM21 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar122,in_ZMM22);
                  auVar73 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar180);
                  in_ZMM20 = vfmadd213ps_avx512f(auVar73,auVar72,in_ZMM21);
                  *pauVar49 = in_ZMM20;
                  pauVar49 = pauVar49 + 1;
                  pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                  iVar40 = iVar40 + 0x10;
                  iVar38 = uVar43 + 8;
                } while (iVar40 <= (int)uVar52);
              }
              for (; iVar38 <= (int)uVar52; iVar38 = iVar38 + 8) {
                uVar3 = *(undefined4 *)*pauVar42;
                auVar164._4_4_ = uVar3;
                auVar164._0_4_ = uVar3;
                auVar164._8_4_ = uVar3;
                auVar164._12_4_ = uVar3;
                auVar164._16_4_ = uVar3;
                auVar164._20_4_ = uVar3;
                auVar164._24_4_ = uVar3;
                auVar164._28_4_ = uVar3;
                auVar180._0_32_ =
                     vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar63,auVar62);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar26._4_4_ = uVar3;
                auVar26._0_4_ = uVar3;
                auVar26._8_4_ = uVar3;
                auVar26._12_4_ = uVar3;
                auVar26._16_4_ = uVar3;
                auVar26._20_4_ = uVar3;
                auVar26._24_4_ = uVar3;
                auVar26._28_4_ = uVar3;
                auVar180._0_32_ = vfmadd213ps_avx512vl(auVar180._0_32_,auVar164,auVar26);
                *(undefined1 (*) [32])*pauVar49 = auVar180._0_32_;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            if (bVar6) {
              uVar45 = 0;
              if (0xf < (int)uVar52) {
                auVar180 = vinsertf64x4_avx512f(in_ZMM18,auVar62,1);
                auVar180 = vpermpd_avx512f(auVar180,0x44);
                auVar72 = vinsertf64x4_avx512f(in_ZMM17,auVar63,1);
                in_ZMM19 = vpermpd_avx512f(auVar72,0x44);
                iVar38 = 0x10;
                do {
                  auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 8)));
                  auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 0xc)));
                  auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar42),
                                             ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                  auVar64 = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                  auVar72 = vinsertf64x4_avx512f(auVar72,auVar64,0);
                  auVar108 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                  in_ZMM22 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                  auVar117._0_48_ = auVar72._0_48_;
                  auVar117._48_8_ = auVar73._48_8_;
                  auVar117._56_8_ = auVar73._56_8_;
                  in_ZMM23 = ZEXT464(*(uint *)(*pauVar37 + 4));
                  auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                             ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                  auVar64 = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                  auVar72 = vinsertf64x4_avx512f(auVar108,auVar64,0);
                  in_ZMM20._0_48_ = auVar72._0_48_;
                  in_ZMM20._48_8_ = in_ZMM22._48_8_;
                  in_ZMM20._56_8_ = in_ZMM22._56_8_;
                  auVar72 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar180);
                  in_ZMM21 = vfmadd213ps_avx512f(auVar72,auVar117,in_ZMM20);
                  *pauVar49 = in_ZMM21;
                  pauVar49 = pauVar49 + 1;
                  pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = iVar38 + 0x10;
                  uVar45 = uVar43;
                } while (iVar38 <= (int)uVar52);
              }
              if ((int)(uVar45 | 8) <= (int)uVar52) {
                auVar180._0_32_ = vpermpd_avx512vl(auVar62,0x44);
                auVar62 = vpermpd_avx512vl(auVar63,0x44);
                in_ZMM19 = ZEXT3264(auVar62);
                uVar39 = uVar45;
                do {
                  auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar42),
                                             ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                  auVar59 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                             ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                  auVar63 = vpermpd_avx2(ZEXT1632(auVar57),0x50);
                  auVar64 = vpermpd_avx512vl(ZEXT1632(auVar59),0x50);
                  in_ZMM20 = ZEXT3264(auVar64);
                  auVar65 = vfmadd132ps_avx512vl
                                      (*(undefined1 (*) [32])*pauVar49,auVar62,auVar180._0_32_);
                  auVar63 = vfmadd213ps_avx512vl(auVar65,auVar63,auVar64);
                  in_ZMM21 = ZEXT3264(auVar63);
                  *(undefined1 (*) [32])*pauVar49 = auVar63;
                  pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                  pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                  uVar45 = uVar39 + 8;
                  iVar38 = uVar39 + 0x10;
                  uVar39 = uVar45;
                } while (iVar38 <= (int)uVar52);
              }
              while (uVar45 = uVar45 + 4, (int)uVar45 <= (int)uVar52) {
                uVar3 = *(undefined4 *)*pauVar42;
                auVar157._4_4_ = uVar3;
                auVar157._0_4_ = uVar3;
                auVar157._8_4_ = uVar3;
                auVar157._12_4_ = uVar3;
                auVar57 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar54,auVar56);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar22._4_4_ = uVar3;
                auVar22._0_4_ = uVar3;
                auVar22._8_4_ = uVar3;
                auVar22._12_4_ = uVar3;
                auVar57 = vfmadd213ps_avx512vl(auVar57,auVar157,auVar22);
                *(undefined1 (*) [16])*pauVar49 = auVar57;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            if (bVar9) {
              in_ZMM19 = vbroadcastss_avx512f(auVar56);
              in_ZMM20 = vbroadcastss_avx512f(auVar54);
              uVar45 = 0;
              if (0xf < (int)uVar52) {
                iVar38 = 0x10;
                do {
                  auVar180 = vfmadd132ps_avx512f(*pauVar49,in_ZMM20,in_ZMM19);
                  auVar180 = vfmadd213ps_avx512f(auVar180,*pauVar42,*pauVar37);
                  *pauVar49 = auVar180;
                  pauVar49 = pauVar49 + 1;
                  pauVar42 = pauVar42 + 1;
                  pauVar37 = pauVar37 + 1;
                  iVar38 = iVar38 + 0x10;
                  uVar45 = uVar43;
                } while (iVar38 <= (int)uVar52);
              }
              uVar39 = uVar45 | 8;
              while ((int)uVar39 <= (int)uVar52) {
                auVar180._0_32_ =
                     vfmadd132ps_avx512vl
                               (*(undefined1 (*) [32])*pauVar49,in_ZMM20._0_32_,in_ZMM19._0_32_);
                auVar57 = vfmadd213ps_fma(auVar180._0_32_,*(undefined1 (*) [32])*pauVar42,
                                          *(undefined1 (*) [32])*pauVar37);
                *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar57);
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                uVar39 = uVar45 + 0x10;
                uVar45 = uVar45 + 8;
              }
              iVar38 = uVar45 + 4;
              while (iVar38 <= (int)uVar52) {
                auVar57 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [16])*pauVar49,in_ZMM20._0_16_,in_ZMM19._0_16_
                                    );
                auVar57 = vfmadd213ps_fma(auVar57,*(undefined1 (*) [16])*pauVar42,
                                          *(undefined1 (*) [16])*pauVar37);
                *(undefined1 (*) [16])*pauVar49 = auVar57;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                iVar38 = uVar45 + 8;
                uVar45 = uVar45 + 4;
              }
              if (uVar52 - uVar45 != 0 && (int)uVar45 <= (int)uVar52) {
                lVar47 = 0;
                do {
                  auVar57 = vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar47 * 4)),auVar54,
                                                auVar56);
                  auVar57 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar42 + lVar47 * 4)),auVar57,
                                            ZEXT416(*(uint *)(*pauVar37 + lVar47 * 4)));
                  *(int *)(*pauVar49 + lVar47 * 4) = auVar57._0_4_;
                  lVar47 = lVar47 + 1;
                } while (uVar52 - uVar45 != (int)lVar47);
              }
            }
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar48);
      }
    }
    else if ((iVar38 == 2) && (0 < (int)uVar43)) {
      uVar48 = iVar40 * iVar36;
      fVar121 = 1.0 / (float)iVar40;
      auVar66 = vbroadcastss_avx512f(ZEXT416((uint)fVar121));
      uVar52 = uVar48 & 0xfffffff0;
      uVar51 = 0;
      auVar67 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar78._0_16_ = vxorps_avx512vl(auVar54,auVar54);
      auVar169._8_4_ = 0x80000000;
      auVar169._0_8_ = 0x8000000080000000;
      auVar169._12_4_ = 0x80000000;
      auVar172._8_4_ = 0xc0400000;
      auVar172._0_8_ = 0xc0400000c0400000;
      auVar172._12_4_ = 0xc0400000;
      auVar175._8_4_ = 0xc0400000;
      auVar175._0_8_ = 0xc0400000c0400000;
      auVar175._12_4_ = 0xc0400000;
      auVar175._16_4_ = 0xc0400000;
      auVar175._20_4_ = 0xc0400000;
      auVar175._24_4_ = 0xc0400000;
      auVar175._28_4_ = 0xc0400000;
      auVar177._8_4_ = 0x80000000;
      auVar177._0_8_ = 0x8000000080000000;
      auVar177._12_4_ = 0x80000000;
      auVar177._16_4_ = 0x80000000;
      auVar177._20_4_ = 0x80000000;
      auVar177._24_4_ = 0x80000000;
      auVar177._28_4_ = 0x80000000;
      auVar69 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
      auVar70 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      auVar71 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      do {
        auVar57 = in_ZMM17._0_16_;
        auVar56 = in_ZMM22._0_16_;
        pauVar49 = (undefined1 (*) [64])
                   ((long)bottom_top_blob->w * uVar51 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar54 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        auVar179 = ZEXT1664(auVar54);
        pauVar37 = pauVar49;
        uVar45 = 0;
        if (0xf < (int)uVar48) {
          iVar38 = 0x10;
          do {
            auVar179 = vaddps_avx512f(auVar179,*pauVar37);
            pauVar37 = pauVar37 + 1;
            iVar38 = iVar38 + 0x10;
            uVar45 = uVar52;
          } while (iVar38 <= (int)uVar48);
        }
        auVar59 = auVar179._0_16_;
        uVar39 = uVar45 | 8;
        auVar54 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        auVar180 = ZEXT1664(auVar54);
        auVar61 = ZEXT1632(auVar54);
        while ((int)uVar39 <= (int)uVar48) {
          auVar61 = vaddps_avx512vl(auVar180._0_32_,*(undefined1 (*) [32])*pauVar37);
          auVar180 = ZEXT3264(auVar61);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
          uVar39 = uVar45 + 0x10;
          uVar45 = uVar45 + 8;
        }
        iVar38 = uVar45 + 4;
        auVar54 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
        while (iVar38 <= (int)uVar48) {
          auVar54 = vaddps_avx512vl(auVar54,*(undefined1 (*) [16])*pauVar37);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
          iVar38 = uVar45 + 8;
          uVar45 = uVar45 + 4;
        }
        auVar55 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar55);
        fVar165 = 0.0;
        if ((int)uVar45 < (int)uVar48) {
          auVar72 = vpbroadcastq_avx512f();
          auVar56 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          uVar46 = 0;
          auVar180 = ZEXT1664(auVar56);
          do {
            auVar108 = auVar180;
            auVar180 = vpbroadcastq_avx512f();
            auVar73 = vporq_avx512f(auVar180,auVar67);
            auVar56 = auVar73._0_16_;
            auVar180 = vporq_avx512f(auVar180,auVar68);
            uVar19 = vpcmpuq_avx512f(auVar180,auVar72,2);
            bVar30 = (byte)uVar19;
            uVar19 = vpcmpuq_avx512f(auVar73,auVar72,2);
            bVar31 = (byte)uVar19;
            uVar53 = CONCAT11(bVar31,bVar30);
            piVar1 = (int *)(*pauVar37 + uVar46 * 4);
            auVar74._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
            auVar74._0_4_ = (uint)(bVar30 & 1) * *piVar1;
            auVar74._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
            auVar74._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
            auVar74._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
            auVar74._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
            auVar74._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
            auVar74._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
            auVar74._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
            auVar74._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
            auVar74._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
            auVar74._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
            auVar74._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
            auVar74._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
            auVar74._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
            auVar74._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
            auVar180 = vaddps_avx512f(auVar74,auVar108);
            uVar46 = uVar46 + 0x10;
          } while (((ulong)(~uVar45 + uVar48) + 0x10 & 0x1fffffff0) != uVar46);
          auVar75._0_4_ =
               (uint)(bVar30 & 1) * auVar180._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar108._0_4_;
          bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
          auVar75._4_4_ = (uint)bVar6 * auVar180._4_4_ | (uint)!bVar6 * auVar108._4_4_;
          bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
          auVar75._8_4_ = (uint)bVar6 * auVar180._8_4_ | (uint)!bVar6 * auVar108._8_4_;
          bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
          auVar75._12_4_ = (uint)bVar6 * auVar180._12_4_ | (uint)!bVar6 * auVar108._12_4_;
          bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
          auVar75._16_4_ = (uint)bVar6 * auVar180._16_4_ | (uint)!bVar6 * auVar108._16_4_;
          bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
          auVar75._20_4_ = (uint)bVar6 * auVar180._20_4_ | (uint)!bVar6 * auVar108._20_4_;
          bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
          auVar75._24_4_ = (uint)bVar6 * auVar180._24_4_ | (uint)!bVar6 * auVar108._24_4_;
          bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
          auVar75._28_4_ = (uint)bVar6 * auVar180._28_4_ | (uint)!bVar6 * auVar108._28_4_;
          auVar75._32_4_ =
               (uint)(bVar31 & 1) * auVar180._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar108._32_4_;
          bVar6 = (bool)(bVar31 >> 1 & 1);
          auVar75._36_4_ = (uint)bVar6 * auVar180._36_4_ | (uint)!bVar6 * auVar108._36_4_;
          bVar6 = (bool)(bVar31 >> 2 & 1);
          auVar75._40_4_ = (uint)bVar6 * auVar180._40_4_ | (uint)!bVar6 * auVar108._40_4_;
          bVar6 = (bool)(bVar31 >> 3 & 1);
          auVar75._44_4_ = (uint)bVar6 * auVar180._44_4_ | (uint)!bVar6 * auVar108._44_4_;
          bVar6 = (bool)(bVar31 >> 4 & 1);
          auVar75._48_4_ = (uint)bVar6 * auVar180._48_4_ | (uint)!bVar6 * auVar108._48_4_;
          bVar6 = (bool)(bVar31 >> 5 & 1);
          auVar75._52_4_ = (uint)bVar6 * auVar180._52_4_ | (uint)!bVar6 * auVar108._52_4_;
          bVar6 = (bool)(bVar31 >> 6 & 1);
          auVar75._56_4_ = (uint)bVar6 * auVar180._56_4_ | (uint)!bVar6 * auVar108._56_4_;
          auVar75._60_4_ =
               (uint)(bVar31 >> 7) * auVar180._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar108._60_4_;
          auVar60 = vextractf64x4_avx512f(auVar75,1);
          auVar180 = vaddps_avx512f(auVar75,ZEXT3264(auVar60));
          auVar57 = vextractf32x4_avx512vl(auVar180._0_32_,1);
          auVar55 = vaddps_avx512vl(auVar180._0_16_,auVar57);
          auVar57 = vshufpd_avx512vl(auVar55,auVar55,1);
          auVar55 = vaddps_avx512vl(auVar55,auVar57);
          auVar55 = vhaddps_avx(auVar55,auVar55);
          fVar165 = auVar55._0_4_;
        }
        in_ZMM20 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
        auVar56 = vpxord_avx512vl(auVar56,auVar56);
        in_ZMM22 = ZEXT1664(auVar56);
        auVar56 = vxorps_avx512vl(auVar57,auVar57);
        in_ZMM17 = ZEXT1664(auVar56);
        auVar56 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
        bVar6 = false;
        auVar57 = auVar61._0_16_;
        auVar180 = ZEXT1664(auVar56);
        if (iVar36 < 8) {
          if (iVar36 == 1) {
            auVar60 = vextractf64x4_avx512f(auVar179,1);
            auVar179 = vaddps_avx512f(auVar179,ZEXT3264(auVar60));
            auVar56 = vextractf32x4_avx512vl(auVar179._0_32_,1);
            auVar56 = vaddps_avx512vl(auVar179._0_16_,auVar56);
            auVar59 = vshufpd_avx512vl(auVar56,auVar56,1);
            auVar56 = vaddps_avx512vl(auVar56,auVar59);
            auVar56 = vhaddps_avx(auVar56,auVar56);
            auVar55 = vextractf32x4_avx512vl(auVar61,1);
            auVar55 = vaddps_avx512vl(auVar55,auVar57);
            auVar58 = vshufps_avx512vl(auVar54,auVar55,0x41);
            auVar55 = vshufps_avx512vl(auVar54,auVar55,0xeb);
            auVar55 = vaddps_avx512vl(auVar55,auVar58);
            auVar58 = vshufpd_avx512vl(auVar55,auVar55,1);
            auVar55 = vaddps_avx512vl(auVar55,auVar58);
            auVar55 = vhaddps_avx(auVar55,auVar55);
            auVar56 = vmulss_avx512f(ZEXT416((uint)(fVar165 + auVar56._0_4_ + auVar55._0_4_)),
                                     ZEXT416((uint)fVar121));
            in_ZMM19 = ZEXT1664(auVar56);
            auVar76._32_32_ = auVar179._32_32_;
            auVar76._0_32_ = vbroadcastss_avx512vl(auVar56);
            auVar78._16_48_ = auVar76._16_48_;
            auVar77._4_60_ = auVar78._4_60_;
            auVar77._0_4_ = auVar76._0_4_;
            in_ZMM17 = ZEXT1664(auVar77._0_16_);
            bVar9 = true;
            bVar6 = false;
            auVar56 = auVar76._0_16_;
          }
          else {
            bVar9 = false;
            bVar8 = false;
            if (iVar36 != 4) goto LAB_004e0ad0;
            auVar60 = vextractf64x4_avx512f(auVar179,1);
            auVar61 = vaddps_avx512vl(auVar179._0_32_,auVar61);
            fVar165 = auVar61._4_4_ + auVar60._4_4_;
            auVar140._0_4_ = auVar61._16_4_ + auVar60._16_4_ + auVar61._0_4_ + auVar60._0_4_;
            auVar140._4_4_ = fVar165 + fVar165;
            auVar140._8_4_ = auVar61._24_4_ + auVar60._24_4_ + auVar61._8_4_ + auVar60._8_4_;
            auVar140._12_4_ = auVar61._28_4_ + auVar60._28_4_ + auVar61._12_4_ + auVar60._12_4_;
            auVar56 = vaddps_avx512vl(auVar140,auVar54);
            auVar56 = vmulps_avx512vl(auVar56,auVar66._0_16_);
            in_ZMM17 = ZEXT1664(auVar56);
            auVar76._0_32_ = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar56,1);
            bVar6 = true;
            bVar9 = false;
            in_ZMM19 = in_ZMM17;
          }
          in_ZMM22 = ZEXT1664(auVar56);
          bVar8 = false;
          auVar180 = ZEXT3264(auVar76._0_32_);
LAB_004e0ad0:
          auVar61 = auVar180._0_32_;
          auVar179 = vinsertf64x4_avx512f(auVar180,auVar61,1);
          bVar10 = false;
        }
        else {
          if (iVar36 == 8) {
            auVar60 = vextractf64x4_avx512f(auVar179,1);
            auVar61 = vaddps_avx512vl(auVar179._0_32_,auVar61);
            auVar158._0_4_ = auVar61._0_4_ + auVar60._0_4_;
            auVar158._4_4_ = auVar61._4_4_ + auVar60._4_4_;
            auVar158._8_4_ = auVar61._8_4_ + auVar60._8_4_;
            auVar158._12_4_ = auVar61._12_4_ + auVar60._12_4_;
            auVar158._16_4_ = auVar61._16_4_ + auVar60._16_4_;
            auVar158._20_4_ = auVar61._20_4_ + auVar60._20_4_;
            auVar158._24_4_ = auVar61._24_4_ + auVar60._24_4_;
            auVar158._28_4_ = auVar61._28_4_ + auVar60._28_4_;
            auVar61 = vmulps_avx512vl(auVar158,auVar66._0_32_);
            in_ZMM17 = ZEXT3264(auVar61);
            auVar56 = vbroadcastss_avx512vl(auVar61._0_16_);
            in_ZMM22 = ZEXT1664(auVar56);
            bVar8 = true;
            bVar6 = false;
            in_ZMM19 = ZEXT1664(auVar61._0_16_);
            bVar9 = false;
            auVar180 = in_ZMM17;
            goto LAB_004e0ad0;
          }
          bVar9 = false;
          bVar8 = false;
          if (iVar36 != 0x10) goto LAB_004e0ad0;
          auVar179 = vmulps_avx512f(auVar179,auVar66);
          auVar61 = vbroadcastss_avx512vl(auVar179._0_16_);
          bVar10 = true;
          bVar6 = false;
          bVar9 = false;
          in_ZMM22 = ZEXT1664(auVar61._0_16_);
          bVar8 = false;
          in_ZMM17 = auVar179;
          in_ZMM19 = auVar179;
        }
        auVar120 = auVar179._16_48_;
        pauVar37 = pauVar49;
        if ((int)uVar48 < 0x10) {
          auVar56 = vxorps_avx512vl(auVar57,auVar57);
          in_ZMM21 = ZEXT1664(auVar56);
          uVar45 = 0;
        }
        else {
          auVar56 = vxorps_avx512vl(auVar57,auVar57);
          in_ZMM21 = ZEXT1664(auVar56);
          iVar38 = 0x10;
          do {
            auVar180 = vsubps_avx512f(*pauVar37,auVar179);
            in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar180,auVar180);
            auVar120 = in_ZMM21._16_48_;
            pauVar37 = pauVar37 + 1;
            iVar38 = iVar38 + 0x10;
            uVar45 = uVar52;
          } while (iVar38 <= (int)uVar48);
        }
        uVar39 = uVar45 | 8;
        auVar79._0_16_ = vxorps_avx512vl(auVar54,auVar54);
        auVar79._16_48_ = auVar120;
        in_ZMM23 = ZEXT1664(auVar79._0_16_);
        while ((int)uVar39 <= (int)uVar48) {
          auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar61);
          auVar79._0_32_ = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar60,auVar60);
          auVar120 = auVar79._16_48_;
          in_ZMM23 = ZEXT3264(auVar79._0_32_);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
          uVar39 = uVar45 + 0x10;
          uVar45 = uVar45 + 8;
        }
        iVar38 = uVar45 + 4;
        auVar54 = vxorps_avx512vl(auVar61._0_16_,auVar61._0_16_);
        while (iVar38 <= (int)uVar48) {
          auVar56 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,in_ZMM22._0_16_);
          auVar54 = vfmadd231ps_avx512vl(auVar54,auVar56,auVar56);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
          iVar38 = uVar45 + 8;
          uVar45 = uVar45 + 4;
        }
        fVar165 = 0.0;
        if ((int)uVar45 < (int)uVar48) {
          auVar179 = vpbroadcastq_avx512f();
          auVar180 = vbroadcastss_avx512f(in_ZMM19._0_16_);
          auVar59 = auVar180._0_16_;
          auVar56 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
          uVar46 = 0;
          in_ZMM26 = ZEXT1664(auVar56);
          do {
            auVar108 = in_ZMM26;
            auVar72 = vpbroadcastq_avx512f();
            auVar73 = vporq_avx512f(auVar72,auVar67);
            auVar72 = vporq_avx512f(auVar72,auVar68);
            uVar19 = vpcmpuq_avx512f(auVar72,auVar179,2);
            bVar30 = (byte)uVar19;
            uVar19 = vpcmpuq_avx512f(auVar73,auVar179,2);
            bVar31 = (byte)uVar19;
            uVar53 = CONCAT11(bVar31,bVar30);
            piVar1 = (int *)(*pauVar37 + uVar46 * 4);
            auVar80._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
            auVar80._0_4_ = (uint)(bVar30 & 1) * *piVar1;
            auVar80._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
            auVar80._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
            auVar80._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
            auVar80._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
            auVar80._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
            auVar80._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
            auVar80._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
            auVar80._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
            auVar80._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
            auVar80._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
            auVar80._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
            auVar80._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
            auVar80._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
            auVar80._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
            auVar72 = vsubps_avx512f(auVar80,auVar180);
            in_ZMM26 = vfmadd213ps_avx512f(auVar72,auVar72,auVar108);
            uVar46 = uVar46 + 0x10;
          } while (((ulong)(~uVar45 + uVar48) + 0x10 & 0x1fffffff0) != uVar46);
          in_ZMM22._0_4_ =
               (uint)(bVar30 & 1) * in_ZMM26._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar108._0_4_;
          bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
          in_ZMM22._4_4_ = (uint)bVar7 * in_ZMM26._4_4_ | (uint)!bVar7 * auVar108._4_4_;
          bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
          in_ZMM22._8_4_ = (uint)bVar7 * in_ZMM26._8_4_ | (uint)!bVar7 * auVar108._8_4_;
          bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
          in_ZMM22._12_4_ = (uint)bVar7 * in_ZMM26._12_4_ | (uint)!bVar7 * auVar108._12_4_;
          bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
          in_ZMM22._16_4_ = (uint)bVar7 * in_ZMM26._16_4_ | (uint)!bVar7 * auVar108._16_4_;
          bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
          in_ZMM22._20_4_ = (uint)bVar7 * in_ZMM26._20_4_ | (uint)!bVar7 * auVar108._20_4_;
          bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
          in_ZMM22._24_4_ = (uint)bVar7 * in_ZMM26._24_4_ | (uint)!bVar7 * auVar108._24_4_;
          bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
          in_ZMM22._28_4_ = (uint)bVar7 * in_ZMM26._28_4_ | (uint)!bVar7 * auVar108._28_4_;
          in_ZMM22._32_4_ =
               (uint)(bVar31 & 1) * in_ZMM26._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar108._32_4_;
          bVar7 = (bool)(bVar31 >> 1 & 1);
          in_ZMM22._36_4_ = (uint)bVar7 * in_ZMM26._36_4_ | (uint)!bVar7 * auVar108._36_4_;
          bVar7 = (bool)(bVar31 >> 2 & 1);
          in_ZMM22._40_4_ = (uint)bVar7 * in_ZMM26._40_4_ | (uint)!bVar7 * auVar108._40_4_;
          bVar7 = (bool)(bVar31 >> 3 & 1);
          in_ZMM22._44_4_ = (uint)bVar7 * in_ZMM26._44_4_ | (uint)!bVar7 * auVar108._44_4_;
          bVar7 = (bool)(bVar31 >> 4 & 1);
          in_ZMM22._48_4_ = (uint)bVar7 * in_ZMM26._48_4_ | (uint)!bVar7 * auVar108._48_4_;
          bVar7 = (bool)(bVar31 >> 5 & 1);
          in_ZMM22._52_4_ = (uint)bVar7 * in_ZMM26._52_4_ | (uint)!bVar7 * auVar108._52_4_;
          bVar7 = (bool)(bVar31 >> 6 & 1);
          in_ZMM22._56_4_ = (uint)bVar7 * in_ZMM26._56_4_ | (uint)!bVar7 * auVar108._56_4_;
          in_ZMM22._60_4_ =
               (uint)(bVar31 >> 7) * in_ZMM26._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar108._60_4_;
          auVar61 = vextractf64x4_avx512f(in_ZMM22,1);
          auVar179 = vaddps_avx512f(in_ZMM22,ZEXT3264(auVar61));
          auVar120 = auVar179._16_48_;
          auVar141._0_4_ = auVar179._0_4_ + auVar179._16_4_;
          auVar141._4_4_ = auVar179._4_4_ + auVar179._20_4_;
          auVar141._8_4_ = auVar179._8_4_ + auVar179._24_4_;
          auVar141._12_4_ = auVar179._12_4_ + auVar179._28_4_;
          auVar56 = vshufpd_avx(auVar141,auVar141,1);
          auVar142._0_4_ = auVar141._0_4_ + auVar56._0_4_;
          auVar142._4_4_ = auVar141._4_4_ + auVar56._4_4_;
          auVar142._8_4_ = auVar141._8_4_ + auVar56._8_4_;
          auVar142._12_4_ = auVar141._12_4_ + auVar56._12_4_;
          auVar56 = vhaddps_avx(auVar142,auVar142);
          fVar165 = auVar56._0_4_;
        }
        if (bVar10) {
          in_ZMM18 = vmulps_avx512f(in_ZMM21,auVar66);
          auVar120 = in_ZMM18._16_48_;
        }
        else {
          auVar56 = vxorps_avx512vl(auVar59,auVar59);
          in_ZMM18 = ZEXT1664(auVar56);
        }
        if (bVar8) {
          auVar61 = vextractf64x4_avx512f(in_ZMM21,1);
          auVar60 = vaddps_avx512vl(in_ZMM21._0_32_,in_ZMM23._0_32_);
          in_ZMM22 = ZEXT3264(auVar60);
          auVar61 = vaddps_avx512vl(auVar60,auVar61);
          in_ZMM23 = ZEXT3264(auVar61);
          auVar61 = vmulps_avx512vl(auVar61,auVar66._0_32_);
          in_ZMM18 = vinsertf64x4_avx512f(in_ZMM18,auVar61,0);
          auVar120 = in_ZMM18._16_48_;
        }
        if (bVar6) {
          auVar61 = vextractf64x4_avx512f(in_ZMM21,1);
          auVar60 = vaddps_avx512vl(in_ZMM21._0_32_,in_ZMM23._0_32_);
          in_ZMM22 = ZEXT3264(auVar60);
          auVar61 = vaddps_avx512vl(auVar60,auVar61);
          in_ZMM23 = ZEXT3264(auVar61);
          auVar56 = vextractf32x4_avx512vl(auVar61,1);
          auVar56 = vaddps_avx512vl(auVar61._0_16_,auVar56);
          auVar54 = vaddps_avx512vl(auVar56,auVar54);
          auVar56 = vmulps_avx512vl(auVar54,auVar66._0_16_);
          in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar56,0);
          auVar120 = in_ZMM18._16_48_;
        }
        in_ZMM24 = ZEXT1664(auVar54);
        if (bVar9) {
          auVar61 = vextractf64x4_avx512f(in_ZMM21,1);
          auVar179 = vaddps_avx512f(in_ZMM21,ZEXT3264(auVar61));
          auVar82._16_48_ = auVar179._16_48_;
          auVar56 = vextractf32x4_avx512vl(auVar179._0_32_,1);
          auVar56 = vaddps_avx512vl(auVar179._0_16_,auVar56);
          auVar57 = vshufpd_avx512vl(auVar56,auVar56,1);
          auVar56 = vaddps_avx512vl(auVar56,auVar57);
          auVar56 = vhaddps_avx(auVar56,auVar56);
          auVar57 = vextractf32x4_avx512vl(in_ZMM23._0_32_,1);
          auVar57 = vaddps_avx512vl(auVar57,in_ZMM23._0_16_);
          auVar59 = vshufps_avx512vl(auVar57,auVar54,0x11);
          auVar54 = vshufps_avx512vl(auVar57,auVar54,0xbb);
          auVar54 = vaddps_avx512vl(auVar54,auVar59);
          auVar57 = vshufpd_avx512vl(auVar54,auVar54,1);
          in_ZMM21 = ZEXT1664(auVar57);
          auVar54 = vaddps_avx512vl(auVar54,auVar57);
          auVar54 = vhaddps_avx(auVar54,auVar54);
          auVar82._0_16_ = in_ZMM18._0_16_;
          auVar81._4_60_ = auVar82._4_60_;
          auVar81._0_4_ = (fVar165 + auVar56._0_4_ + auVar54._0_4_) * fVar121;
          in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar81._0_16_,0);
          auVar120 = in_ZMM18._16_48_;
        }
        auVar54 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
        if (iVar36 < 8) {
          auVar56 = in_ZMM18._0_16_;
          if (iVar36 == 1) {
            auVar57 = vaddss_avx512f(auVar56,auVar54);
            auVar54 = vrsqrtss_avx(auVar57,auVar57);
            auVar57 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar57._0_4_ * auVar54._0_4_)),auVar54,
                                          ZEXT416(0xc0400000));
            fVar165 = auVar54._0_4_ * -0.5 * auVar57._0_4_;
            auVar84._16_48_ = auVar120;
            auVar84._0_16_ = auVar56;
            auVar83._4_60_ = auVar84._4_60_;
            auVar83._0_4_ = fVar165;
            in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar83._0_16_,0);
            auVar86._16_48_ = in_ZMM18._16_48_;
            auVar54 = vxorps_avx512vl(in_ZMM19._0_16_,auVar169);
            auVar86._0_16_ = in_ZMM17._0_16_;
            auVar85._4_60_ = auVar86._4_60_;
            auVar85._0_4_ = fVar165 * auVar54._0_4_;
            in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar85._0_16_,0);
          }
          else if (iVar36 == 4) {
            auVar54 = vbroadcastss_avx512vl(auVar54);
            auVar56 = vaddps_avx512vl(auVar56,auVar54);
            auVar54 = vrsqrtps_avx(auVar56);
            auVar143._0_4_ = auVar56._0_4_ * auVar54._0_4_;
            auVar143._4_4_ = auVar56._4_4_ * auVar54._4_4_;
            auVar143._8_4_ = auVar56._8_4_ * auVar54._8_4_;
            auVar143._12_4_ = auVar56._12_4_ * auVar54._12_4_;
            auVar56 = vfmadd213ps_fma(auVar143,auVar54,auVar172);
            auVar144._0_4_ = auVar54._0_4_ * -0.5 * auVar56._0_4_;
            auVar144._4_4_ = auVar54._4_4_ * -0.5 * auVar56._4_4_;
            auVar144._8_4_ = auVar54._8_4_ * -0.5 * auVar56._8_4_;
            auVar144._12_4_ = auVar54._12_4_ * -0.5 * auVar56._12_4_;
            auVar54 = vxorps_avx512vl(in_ZMM17._0_16_,auVar169);
            auVar166._0_4_ = auVar144._0_4_ * auVar54._0_4_;
            auVar166._4_4_ = auVar144._4_4_ * auVar54._4_4_;
            auVar166._8_4_ = auVar144._8_4_ * auVar54._8_4_;
            auVar166._12_4_ = auVar144._12_4_ * auVar54._12_4_;
            in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar144,0);
            in_ZMM17 = vinsertf32x4_avx512f(in_ZMM17,auVar166,0);
          }
        }
        else if (iVar36 == 8) {
          auVar61 = vbroadcastss_avx512vl(auVar54);
          auVar60 = vaddps_avx512vl(in_ZMM18._0_32_,auVar61);
          auVar61 = vrsqrtps_avx(auVar60);
          auVar32._4_4_ = auVar60._4_4_ * auVar61._4_4_;
          auVar32._0_4_ = auVar60._0_4_ * auVar61._0_4_;
          auVar32._8_4_ = auVar60._8_4_ * auVar61._8_4_;
          auVar32._12_4_ = auVar60._12_4_ * auVar61._12_4_;
          auVar32._16_4_ = auVar60._16_4_ * auVar61._16_4_;
          auVar32._20_4_ = auVar60._20_4_ * auVar61._20_4_;
          auVar32._24_4_ = auVar60._24_4_ * auVar61._24_4_;
          auVar32._28_4_ = auVar60._28_4_;
          auVar54 = vfmadd213ps_fma(auVar32,auVar61,auVar175);
          auVar159._0_4_ = auVar61._0_4_ * -0.5 * auVar54._0_4_;
          auVar159._4_4_ = auVar61._4_4_ * -0.5 * auVar54._4_4_;
          auVar159._8_4_ = auVar61._8_4_ * -0.5 * auVar54._8_4_;
          auVar159._12_4_ = auVar61._12_4_ * -0.5 * auVar54._12_4_;
          auVar159._16_4_ = auVar61._16_4_ * -0.5 * 0.0;
          auVar159._20_4_ = auVar61._20_4_ * -0.5 * 0.0;
          auVar159._24_4_ = auVar61._24_4_ * -0.5 * 0.0;
          auVar159._28_4_ = 0;
          auVar61 = vxorps_avx512vl(in_ZMM17._0_32_,auVar177);
          auVar33._4_4_ = auVar159._4_4_ * auVar61._4_4_;
          auVar33._0_4_ = auVar159._0_4_ * auVar61._0_4_;
          auVar33._8_4_ = auVar159._8_4_ * auVar61._8_4_;
          auVar33._12_4_ = auVar159._12_4_ * auVar61._12_4_;
          auVar33._16_4_ = auVar159._16_4_ * auVar61._16_4_;
          auVar33._20_4_ = auVar159._20_4_ * auVar61._20_4_;
          auVar33._24_4_ = auVar159._24_4_ * auVar61._24_4_;
          auVar33._28_4_ = auVar61._28_4_;
          in_ZMM18 = vinsertf64x4_avx512f(in_ZMM18,auVar159,0);
          in_ZMM17 = vinsertf64x4_avx512f(in_ZMM17,auVar33,0);
        }
        else if (iVar36 == 0x10) {
          auVar179 = vbroadcastss_avx512f(auVar54);
          auVar179 = vaddps_avx512f(in_ZMM18,auVar179);
          auVar180 = vrsqrt14ps_avx512f(auVar179);
          auVar179 = vmulps_avx512f(auVar179,auVar180);
          auVar179 = vfmadd213ps_avx512f(auVar179,auVar180,auVar69);
          auVar180 = vmulps_avx512f(auVar180,auVar70);
          in_ZMM18 = vmulps_avx512f(auVar180,auVar179);
          auVar179 = vxorps_avx512dq(in_ZMM17,auVar71);
          in_ZMM17 = vmulps_avx512f(in_ZMM18,auVar179);
        }
        auVar56 = in_ZMM18._0_16_;
        auVar61 = in_ZMM18._0_32_;
        auVar54 = in_ZMM17._0_16_;
        auVar60 = in_ZMM17._0_32_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var4[-3]) == 0) {
          auVar57 = auVar54;
          auVar59 = auVar56;
          if (!bVar6) {
            auVar59 = vbroadcastss_avx512vl(auVar56);
            auVar57 = vbroadcastss_avx512vl(auVar54);
          }
          in_ZMM20 = ZEXT1664(auVar57);
          in_ZMM19 = ZEXT1664(auVar59);
          if (!bVar8) {
            auVar61 = vinsertf32x4_avx512vl(ZEXT1632(auVar59),auVar59,1);
            auVar60 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
          }
          in_ZMM22 = ZEXT3264(auVar60);
          in_ZMM21 = ZEXT3264(auVar61);
          in_ZMM23 = in_ZMM17;
          auVar179 = in_ZMM18;
          if (!bVar10) {
            auVar179 = vinsertf64x4_avx512f(in_ZMM21,auVar61,1);
            in_ZMM23 = vinsertf64x4_avx512f(in_ZMM22,auVar60,1);
          }
          uVar45 = 0;
          if (0xf < (int)uVar48) {
            iVar38 = 0x10;
            do {
              auVar180 = vfmadd132ps_avx512f(*pauVar49,in_ZMM23,auVar179);
              *pauVar49 = auVar180;
              pauVar49 = pauVar49 + 1;
              iVar38 = iVar38 + 0x10;
              uVar45 = uVar52;
            } while (iVar38 <= (int)uVar48);
          }
          uVar39 = uVar45 | 8;
          while ((int)uVar39 <= (int)uVar48) {
            auVar180._0_32_ = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar60,auVar61);
            *(undefined1 (*) [32])*pauVar49 = auVar180._0_32_;
            pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
            uVar39 = uVar45 + 0x10;
            uVar45 = uVar45 + 8;
          }
          iVar38 = uVar45 + 4;
          while (iVar38 <= (int)uVar48) {
            auVar55 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar57,auVar59);
            *(undefined1 (*) [16])*pauVar49 = auVar55;
            pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
            iVar38 = uVar45 + 8;
            uVar45 = uVar45 + 4;
          }
          if ((int)uVar45 < (int)uVar48) {
            auVar179 = vpbroadcastq_avx512f();
            in_ZMM18 = vbroadcastss_avx512f(auVar56);
            in_ZMM17 = vbroadcastss_avx512f(auVar54);
            uVar46 = 0;
            do {
              auVar180 = vpbroadcastq_avx512f();
              in_ZMM19 = vporq_avx512f(auVar180,auVar67);
              auVar180 = vporq_avx512f(auVar180,auVar68);
              uVar19 = vpcmpuq_avx512f(auVar180,auVar179,2);
              bVar30 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(in_ZMM19,auVar179,2);
              bVar31 = (byte)uVar19;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar49 + uVar46 * 4);
              auVar88._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar88._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar88._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar88._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar88._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar88._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar88._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar88._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar88._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar88._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar88._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar88._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar88._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar88._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar88._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar88._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar72 = vfmadd213ps_avx512f(auVar88,in_ZMM18,in_ZMM17);
              auVar180 = *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4);
              auVar89._0_4_ =
                   (uint)(bVar30 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar180._0_4_;
              bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
              auVar89._4_4_ = (uint)bVar6 * auVar72._4_4_ | (uint)!bVar6 * auVar180._4_4_;
              bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
              auVar89._8_4_ = (uint)bVar6 * auVar72._8_4_ | (uint)!bVar6 * auVar180._8_4_;
              bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
              auVar89._12_4_ = (uint)bVar6 * auVar72._12_4_ | (uint)!bVar6 * auVar180._12_4_;
              bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
              auVar89._16_4_ = (uint)bVar6 * auVar72._16_4_ | (uint)!bVar6 * auVar180._16_4_;
              bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
              auVar89._20_4_ = (uint)bVar6 * auVar72._20_4_ | (uint)!bVar6 * auVar180._20_4_;
              bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
              auVar89._24_4_ = (uint)bVar6 * auVar72._24_4_ | (uint)!bVar6 * auVar180._24_4_;
              bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
              auVar89._28_4_ = (uint)bVar6 * auVar72._28_4_ | (uint)!bVar6 * auVar180._28_4_;
              auVar89._32_4_ =
                   (uint)(bVar31 & 1) * auVar72._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar180._32_4_
              ;
              bVar6 = (bool)(bVar31 >> 1 & 1);
              auVar89._36_4_ = (uint)bVar6 * auVar72._36_4_ | (uint)!bVar6 * auVar180._36_4_;
              bVar6 = (bool)(bVar31 >> 2 & 1);
              auVar89._40_4_ = (uint)bVar6 * auVar72._40_4_ | (uint)!bVar6 * auVar180._40_4_;
              bVar6 = (bool)(bVar31 >> 3 & 1);
              auVar89._44_4_ = (uint)bVar6 * auVar72._44_4_ | (uint)!bVar6 * auVar180._44_4_;
              bVar6 = (bool)(bVar31 >> 4 & 1);
              auVar89._48_4_ = (uint)bVar6 * auVar72._48_4_ | (uint)!bVar6 * auVar180._48_4_;
              bVar6 = (bool)(bVar31 >> 5 & 1);
              auVar89._52_4_ = (uint)bVar6 * auVar72._52_4_ | (uint)!bVar6 * auVar180._52_4_;
              bVar6 = (bool)(bVar31 >> 6 & 1);
              auVar89._56_4_ = (uint)bVar6 * auVar72._56_4_ | (uint)!bVar6 * auVar180._56_4_;
              auVar89._60_4_ =
                   (uint)(bVar31 >> 7) * auVar72._60_4_ |
                   (uint)!(bool)(bVar31 >> 7) * auVar180._60_4_;
              *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4) = auVar89;
              uVar46 = uVar46 + 0x10;
            } while (((ulong)(~uVar45 + uVar48) + 0x10 & 0x1fffffff0) != uVar46);
          }
        }
        else {
          pauVar37 = pauVar50;
          pauVar42 = pauVar44;
          if (bVar10 && 0xf < (int)uVar48) {
            iVar38 = 0x10;
            do {
              auVar179 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar37));
              auVar180 = vfmadd132ps_avx512f(*pauVar49,in_ZMM17,in_ZMM18);
              uVar3 = *(undefined4 *)*pauVar42;
              auVar27._4_4_ = uVar3;
              auVar27._0_4_ = uVar3;
              auVar27._8_4_ = uVar3;
              auVar27._12_4_ = uVar3;
              auVar27._16_4_ = uVar3;
              auVar27._20_4_ = uVar3;
              auVar27._24_4_ = uVar3;
              auVar27._28_4_ = uVar3;
              auVar27._32_4_ = uVar3;
              auVar27._36_4_ = uVar3;
              auVar27._40_4_ = uVar3;
              auVar27._44_4_ = uVar3;
              auVar27._48_4_ = uVar3;
              auVar27._52_4_ = uVar3;
              auVar27._56_4_ = uVar3;
              auVar27._60_4_ = uVar3;
              auVar179 = vfmadd213ps_avx512f(auVar180,auVar179,auVar27);
              *pauVar49 = auVar179;
              pauVar49 = pauVar49 + 1;
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
              iVar38 = iVar38 + 0x10;
            } while (iVar38 <= (int)uVar48);
          }
          if (bVar8) {
            iVar38 = 8;
            if (0xf < (int)uVar48) {
              auVar179 = vinsertf64x4_avx512f(in_ZMM18,auVar61,1);
              in_ZMM19 = vinsertf64x4_avx512f(in_ZMM17,auVar60,1);
              iVar40 = 0x10;
              do {
                in_ZMM22 = ZEXT464(*(uint *)(*pauVar42 + 4));
                auVar180 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar122,
                                             ZEXT464(*(uint *)(*pauVar37 + 4)));
                in_ZMM21 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar42),auVar122,in_ZMM22);
                auVar72 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar179);
                in_ZMM20 = vfmadd213ps_avx512f(auVar72,auVar180,in_ZMM21);
                *pauVar49 = in_ZMM20;
                pauVar49 = pauVar49 + 1;
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                iVar40 = iVar40 + 0x10;
                iVar38 = uVar52 + 8;
              } while (iVar40 <= (int)uVar48);
            }
            for (; iVar38 <= (int)uVar48; iVar38 = iVar38 + 8) {
              uVar3 = *(undefined4 *)*pauVar37;
              auVar160._4_4_ = uVar3;
              auVar160._0_4_ = uVar3;
              auVar160._8_4_ = uVar3;
              auVar160._12_4_ = uVar3;
              auVar160._16_4_ = uVar3;
              auVar160._20_4_ = uVar3;
              auVar160._24_4_ = uVar3;
              auVar160._28_4_ = uVar3;
              auVar180._0_32_ =
                   vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar60,auVar61);
              uVar3 = *(undefined4 *)*pauVar42;
              auVar24._4_4_ = uVar3;
              auVar24._0_4_ = uVar3;
              auVar24._8_4_ = uVar3;
              auVar24._12_4_ = uVar3;
              auVar24._16_4_ = uVar3;
              auVar24._20_4_ = uVar3;
              auVar24._24_4_ = uVar3;
              auVar24._28_4_ = uVar3;
              auVar180._0_32_ = vfmadd213ps_avx512vl(auVar180._0_32_,auVar160,auVar24);
              *(undefined1 (*) [32])*pauVar49 = auVar180._0_32_;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
            }
          }
          if (bVar6) {
            uVar45 = 0;
            if (0xf < (int)uVar48) {
              auVar179 = vinsertf64x4_avx512f(in_ZMM18,auVar61,1);
              auVar179 = vpermpd_avx512f(auVar179,0x44);
              auVar180 = vinsertf64x4_avx512f(in_ZMM17,auVar60,1);
              in_ZMM19 = vpermpd_avx512f(auVar180,0x44);
              iVar38 = 0x10;
              do {
                auVar180 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                           ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                auVar62 = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                auVar180 = vinsertf64x4_avx512f(auVar180,auVar62,0);
                auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 8)));
                in_ZMM22 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 0xc)));
                auVar87._0_48_ = auVar180._0_48_;
                auVar87._48_8_ = auVar72._48_8_;
                auVar87._56_8_ = auVar72._56_8_;
                in_ZMM23 = ZEXT464(*(uint *)(*pauVar42 + 4));
                auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar42),
                                           ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                auVar180._0_32_ = vpermpd_avx512vl(ZEXT1632(auVar57),0x50);
                auVar180 = vinsertf64x4_avx512f(auVar73,auVar180._0_32_,0);
                in_ZMM20._0_48_ = auVar180._0_48_;
                in_ZMM20._48_8_ = in_ZMM22._48_8_;
                in_ZMM20._56_8_ = in_ZMM22._56_8_;
                auVar180 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar179);
                in_ZMM21 = vfmadd213ps_avx512f(auVar180,auVar87,in_ZMM20);
                *pauVar49 = in_ZMM21;
                pauVar49 = pauVar49 + 1;
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                iVar38 = iVar38 + 0x10;
                uVar45 = uVar52;
              } while (iVar38 <= (int)uVar48);
            }
            if ((int)(uVar45 | 8) <= (int)uVar48) {
              auVar61 = vpermpd_avx512vl(auVar61,0x44);
              auVar60 = vpermpd_avx512vl(auVar60,0x44);
              in_ZMM19 = ZEXT3264(auVar60);
              uVar39 = uVar45;
              do {
                auVar57 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                           ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                auVar59 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar42),
                                           ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                auVar180._0_32_ = vpermpd_avx2(ZEXT1632(auVar57),0x50);
                auVar62 = vpermpd_avx512vl(ZEXT1632(auVar59),0x50);
                in_ZMM20 = ZEXT3264(auVar62);
                auVar63 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar60,auVar61);
                auVar180._0_32_ = vfmadd213ps_avx512vl(auVar63,auVar180._0_32_,auVar62);
                in_ZMM21 = ZEXT3264(auVar180._0_32_);
                *(undefined1 (*) [32])*pauVar49 = auVar180._0_32_;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                uVar45 = uVar39 + 8;
                iVar38 = uVar39 + 0x10;
                uVar39 = uVar45;
              } while (iVar38 <= (int)uVar48);
            }
            while (uVar45 = uVar45 + 4, (int)uVar45 <= (int)uVar48) {
              uVar3 = *(undefined4 *)*pauVar37;
              auVar145._4_4_ = uVar3;
              auVar145._0_4_ = uVar3;
              auVar145._8_4_ = uVar3;
              auVar145._12_4_ = uVar3;
              auVar57 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar54,auVar56);
              uVar3 = *(undefined4 *)*pauVar42;
              auVar20._4_4_ = uVar3;
              auVar20._0_4_ = uVar3;
              auVar20._8_4_ = uVar3;
              auVar20._12_4_ = uVar3;
              auVar57 = vfmadd213ps_avx512vl(auVar57,auVar145,auVar20);
              *(undefined1 (*) [16])*pauVar49 = auVar57;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
            }
          }
          if (bVar9) {
            in_ZMM19 = vbroadcastss_avx512f(auVar56);
            in_ZMM20 = vbroadcastss_avx512f(auVar54);
            uVar45 = 0;
            if (0xf < (int)uVar48) {
              iVar38 = 0x10;
              do {
                auVar179 = vfmadd132ps_avx512f(*pauVar49,in_ZMM20,in_ZMM19);
                auVar179 = vfmadd213ps_avx512f(auVar179,*pauVar37,*pauVar42);
                *pauVar49 = auVar179;
                pauVar49 = pauVar49 + 1;
                pauVar37 = pauVar37 + 1;
                pauVar42 = pauVar42 + 1;
                iVar38 = iVar38 + 0x10;
                uVar45 = uVar52;
              } while (iVar38 <= (int)uVar48);
            }
            uVar39 = uVar45 | 8;
            while ((int)uVar39 <= (int)uVar48) {
              auVar61 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])*pauVar49,in_ZMM20._0_32_,in_ZMM19._0_32_);
              auVar57 = vfmadd213ps_fma(auVar61,*(undefined1 (*) [32])*pauVar37,
                                        *(undefined1 (*) [32])*pauVar42);
              *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar57);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
              uVar39 = uVar45 + 0x10;
              uVar45 = uVar45 + 8;
            }
            iVar38 = uVar45 + 4;
            while (iVar38 <= (int)uVar48) {
              auVar57 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [16])*pauVar49,in_ZMM20._0_16_,in_ZMM19._0_16_);
              auVar57 = vfmadd213ps_fma(auVar57,*(undefined1 (*) [16])*pauVar37,
                                        *(undefined1 (*) [16])*pauVar42);
              *(undefined1 (*) [16])*pauVar49 = auVar57;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
              iVar38 = uVar45 + 8;
              uVar45 = uVar45 + 4;
            }
            if (uVar48 - uVar45 != 0 && (int)uVar45 <= (int)uVar48) {
              lVar47 = 0;
              do {
                auVar57 = vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar47 * 4)),auVar54,
                                              auVar56);
                auVar57 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar37 + lVar47 * 4)),auVar57,
                                          ZEXT416(*(uint *)(*pauVar42 + lVar47 * 4)));
                *(int *)(*pauVar49 + lVar47 * 4) = auVar57._0_4_;
                lVar47 = lVar47 + 1;
              } while (uVar48 - uVar45 != (int)lVar47);
            }
          }
        }
        uVar51 = uVar51 + 1;
      } while (uVar51 != uVar43);
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}